

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  ulong uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  byte bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  long lVar84;
  ulong uVar85;
  Geometry *pGVar86;
  long lVar87;
  long lVar88;
  byte bVar89;
  ulong uVar90;
  float fVar91;
  float fVar92;
  float fVar148;
  float fVar150;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar119 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar99 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar100 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined4 uVar168;
  undefined8 uVar169;
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar178;
  undefined1 auVar177 [32];
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 (*local_630) [32];
  Precalculations *local_628;
  undefined1 local_620 [32];
  ulong local_5f8;
  LinearSpace3fa *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  
  uVar81 = (ulong)(byte)prim[1];
  lVar87 = uVar81 * 0x25;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar81 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar94);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar81 * 5 + 6);
  auVar112 = vpmovsxbd_avx2(auVar93);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar81 * 6 + 6);
  auVar118 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar81 * 0xf + 6);
  auVar117 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar116 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar81 * 0x11 + 6);
  auVar113 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar81 * 0x1a + 6);
  auVar114 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar81 * 0x1b + 6);
  auVar107 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 * 0x1c + 6);
  auVar108 = vpmovsxbd_avx2(auVar12);
  uVar168 = *(undefined4 *)(prim + lVar87 + 0x12);
  auVar218._4_4_ = uVar168;
  auVar218._0_4_ = uVar168;
  auVar218._8_4_ = uVar168;
  auVar218._12_4_ = uVar168;
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar93 = vsubps_avx512vl(auVar94,*(undefined1 (*) [16])(prim + lVar87 + 6));
  fVar172 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar87 + 0x16)) *
            *(float *)(prim + lVar87 + 0x1a);
  auVar119 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 7 + 6));
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0xb + 6));
  auVar121 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 9 + 6));
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0xd + 6));
  auVar101 = vpbroadcastd_avx512vl();
  auVar94 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar94 = vinsertps_avx512f(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar93 = vmulps_avx512vl(auVar218,auVar93);
  auVar94 = vmulps_avx512vl(auVar218,auVar94);
  auVar102 = vcvtdq2ps_avx512vl(auVar115);
  auVar103 = vcvtdq2ps_avx512vl(auVar112);
  auVar104 = vcvtdq2ps_avx512vl(auVar118);
  auVar105 = vcvtdq2ps_avx512vl(auVar117);
  auVar106 = vcvtdq2ps_avx512vl(auVar116);
  auVar115 = vcvtdq2ps_avx(auVar113);
  auVar118 = vcvtdq2ps_avx(auVar114);
  auVar117 = vcvtdq2ps_avx(auVar107);
  auVar116 = vcvtdq2ps_avx(auVar108);
  uVar168 = auVar94._0_4_;
  auVar213._4_4_ = uVar168;
  auVar213._0_4_ = uVar168;
  auVar213._8_4_ = uVar168;
  auVar213._12_4_ = uVar168;
  auVar213._16_4_ = uVar168;
  auVar213._20_4_ = uVar168;
  auVar213._24_4_ = uVar168;
  auVar213._28_4_ = uVar168;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar108 = vpermps_avx512vl(auVar107,ZEXT1632(auVar94));
  auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = vpermps_avx512vl(auVar109,ZEXT1632(auVar94));
  auVar111 = vmulps_avx512vl(auVar110,auVar104);
  auVar113._4_4_ = auVar110._4_4_ * auVar115._4_4_;
  auVar113._0_4_ = auVar110._0_4_ * auVar115._0_4_;
  auVar113._8_4_ = auVar110._8_4_ * auVar115._8_4_;
  auVar113._12_4_ = auVar110._12_4_ * auVar115._12_4_;
  auVar113._16_4_ = auVar110._16_4_ * auVar115._16_4_;
  auVar113._20_4_ = auVar110._20_4_ * auVar115._20_4_;
  auVar113._24_4_ = auVar110._24_4_ * auVar115._24_4_;
  auVar113._28_4_ = auVar112._28_4_;
  auVar114._4_4_ = auVar116._4_4_ * auVar110._4_4_;
  auVar114._0_4_ = auVar116._0_4_ * auVar110._0_4_;
  auVar114._8_4_ = auVar116._8_4_ * auVar110._8_4_;
  auVar114._12_4_ = auVar116._12_4_ * auVar110._12_4_;
  auVar114._16_4_ = auVar116._16_4_ * auVar110._16_4_;
  auVar114._20_4_ = auVar116._20_4_ * auVar110._20_4_;
  auVar114._24_4_ = auVar116._24_4_ * auVar110._24_4_;
  auVar114._28_4_ = auVar110._28_4_;
  auVar112 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar103);
  auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar106);
  auVar94 = vfmadd231ps_fma(auVar114,auVar117,auVar108);
  auVar112 = vfmadd231ps_avx512vl(auVar112,auVar213,auVar102);
  auVar113 = vfmadd231ps_avx512vl(auVar113,auVar213,auVar105);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar118,auVar213);
  auVar114 = vbroadcastss_avx512vl(auVar93);
  auVar107 = vpermps_avx512vl(auVar107,ZEXT1632(auVar93));
  auVar108 = vpermps_avx512vl(auVar109,ZEXT1632(auVar93));
  auVar104 = vmulps_avx512vl(auVar108,auVar104);
  auVar115 = vmulps_avx512vl(auVar108,auVar115);
  auVar116 = vmulps_avx512vl(auVar108,auVar116);
  auVar108 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar103);
  auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,auVar106);
  auVar117 = vfmadd231ps_avx512vl(auVar116,auVar107,auVar117);
  auVar116 = vfmadd231ps_avx512vl(auVar108,auVar114,auVar102);
  auVar102 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar105);
  auVar218 = vfmadd231ps_fma(auVar117,auVar114,auVar118);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar115 = vandps_avx(auVar109,auVar112);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar115,auVar106,1);
  bVar20 = (bool)((byte)uVar85 & 1);
  auVar103._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._0_4_;
  bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._4_4_;
  bVar20 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._8_4_;
  bVar20 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._12_4_;
  bVar20 = (bool)((byte)(uVar85 >> 4) & 1);
  auVar103._16_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._16_4_;
  bVar20 = (bool)((byte)(uVar85 >> 5) & 1);
  auVar103._20_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._20_4_;
  bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
  auVar103._24_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._24_4_;
  bVar20 = SUB81(uVar85 >> 7,0);
  auVar103._28_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar112._28_4_;
  auVar115 = vandps_avx(auVar109,auVar113);
  uVar85 = vcmpps_avx512vl(auVar115,auVar106,1);
  bVar20 = (bool)((byte)uVar85 & 1);
  auVar104._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._0_4_;
  bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._4_4_;
  bVar20 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._8_4_;
  bVar20 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._12_4_;
  bVar20 = (bool)((byte)(uVar85 >> 4) & 1);
  auVar104._16_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._16_4_;
  bVar20 = (bool)((byte)(uVar85 >> 5) & 1);
  auVar104._20_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._20_4_;
  bVar20 = (bool)((byte)(uVar85 >> 6) & 1);
  auVar104._24_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._24_4_;
  bVar20 = SUB81(uVar85 >> 7,0);
  auVar104._28_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar113._28_4_;
  auVar115 = vandps_avx(auVar109,ZEXT1632(auVar94));
  uVar85 = vcmpps_avx512vl(auVar115,auVar106,1);
  bVar20 = (bool)((byte)uVar85 & 1);
  auVar115._0_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar94._0_4_;
  bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar94._4_4_;
  bVar20 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar94._8_4_;
  bVar20 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar20 * 0x219392ef | (uint)!bVar20 * auVar94._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar118 = vrcp14ps_avx512vl(auVar103);
  auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar221 = ZEXT3264(auVar117);
  auVar112 = vfnmadd213ps_avx512vl(auVar103,auVar118,auVar117);
  auVar94 = vfmadd132ps_fma(auVar112,auVar118,auVar118);
  auVar118 = vrcp14ps_avx512vl(auVar104);
  auVar112 = vfnmadd213ps_avx512vl(auVar104,auVar118,auVar117);
  auVar93 = vfmadd132ps_fma(auVar112,auVar118,auVar118);
  auVar118 = vrcp14ps_avx512vl(auVar115);
  auVar115 = vfnmadd213ps_avx512vl(auVar115,auVar118,auVar117);
  auVar6 = vfmadd132ps_fma(auVar115,auVar118,auVar118);
  auVar105._4_4_ = fVar172;
  auVar105._0_4_ = fVar172;
  auVar105._8_4_ = fVar172;
  auVar105._12_4_ = fVar172;
  auVar105._16_4_ = fVar172;
  auVar105._20_4_ = fVar172;
  auVar105._24_4_ = fVar172;
  auVar105._28_4_ = fVar172;
  auVar115 = vcvtdq2ps_avx(auVar119);
  auVar118 = vcvtdq2ps_avx(auVar120);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar7 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vcvtdq2ps_avx(auVar121);
  auVar118 = vcvtdq2ps_avx(auVar122);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar8 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x12 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x16 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar9 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x14 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x18 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x1d + 6));
  auVar10 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vcvtdq2ps_avx(auVar117);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x21 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar11 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x1f + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x23 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar115);
  auVar12 = vfmadd213ps_fma(auVar118,auVar105,auVar115);
  auVar115 = vsubps_avx(ZEXT1632(auVar7),auVar116);
  auVar107._4_4_ = auVar94._4_4_ * auVar115._4_4_;
  auVar107._0_4_ = auVar94._0_4_ * auVar115._0_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar115._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar115._12_4_;
  auVar107._16_4_ = auVar115._16_4_ * 0.0;
  auVar107._20_4_ = auVar115._20_4_ * 0.0;
  auVar107._24_4_ = auVar115._24_4_ * 0.0;
  auVar107._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar8),auVar116);
  auVar122._0_4_ = auVar94._0_4_ * auVar115._0_4_;
  auVar122._4_4_ = auVar94._4_4_ * auVar115._4_4_;
  auVar122._8_4_ = auVar94._8_4_ * auVar115._8_4_;
  auVar122._12_4_ = auVar94._12_4_ * auVar115._12_4_;
  auVar122._16_4_ = auVar115._16_4_ * 0.0;
  auVar122._20_4_ = auVar115._20_4_ * 0.0;
  auVar122._24_4_ = auVar115._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar115 = vsubps_avx(ZEXT1632(auVar9),auVar102);
  auVar108._4_4_ = auVar93._4_4_ * auVar115._4_4_;
  auVar108._0_4_ = auVar93._0_4_ * auVar115._0_4_;
  auVar108._8_4_ = auVar93._8_4_ * auVar115._8_4_;
  auVar108._12_4_ = auVar93._12_4_ * auVar115._12_4_;
  auVar108._16_4_ = auVar115._16_4_ * 0.0;
  auVar108._20_4_ = auVar115._20_4_ * 0.0;
  auVar108._24_4_ = auVar115._24_4_ * 0.0;
  auVar108._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar10),auVar102);
  auVar121._0_4_ = auVar93._0_4_ * auVar115._0_4_;
  auVar121._4_4_ = auVar93._4_4_ * auVar115._4_4_;
  auVar121._8_4_ = auVar93._8_4_ * auVar115._8_4_;
  auVar121._12_4_ = auVar93._12_4_ * auVar115._12_4_;
  auVar121._16_4_ = auVar115._16_4_ * 0.0;
  auVar121._20_4_ = auVar115._20_4_ * 0.0;
  auVar121._24_4_ = auVar115._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar115 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar218));
  auVar119._4_4_ = auVar6._4_4_ * auVar115._4_4_;
  auVar119._0_4_ = auVar6._0_4_ * auVar115._0_4_;
  auVar119._8_4_ = auVar6._8_4_ * auVar115._8_4_;
  auVar119._12_4_ = auVar6._12_4_ * auVar115._12_4_;
  auVar119._16_4_ = auVar115._16_4_ * 0.0;
  auVar119._20_4_ = auVar115._20_4_ * 0.0;
  auVar119._24_4_ = auVar115._24_4_ * 0.0;
  auVar119._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar218));
  auVar120._0_4_ = auVar6._0_4_ * auVar115._0_4_;
  auVar120._4_4_ = auVar6._4_4_ * auVar115._4_4_;
  auVar120._8_4_ = auVar6._8_4_ * auVar115._8_4_;
  auVar120._12_4_ = auVar6._12_4_ * auVar115._12_4_;
  auVar120._16_4_ = auVar115._16_4_ * 0.0;
  auVar120._20_4_ = auVar115._20_4_ * 0.0;
  auVar120._24_4_ = auVar115._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar107,auVar122);
  auVar118 = vpminsd_avx2(auVar108,auVar121);
  auVar115 = vmaxps_avx(auVar115,auVar118);
  auVar118 = vpminsd_avx2(auVar119,auVar120);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar117._4_4_ = uVar168;
  auVar117._0_4_ = uVar168;
  auVar117._8_4_ = uVar168;
  auVar117._12_4_ = uVar168;
  auVar117._16_4_ = uVar168;
  auVar117._20_4_ = uVar168;
  auVar117._24_4_ = uVar168;
  auVar117._28_4_ = uVar168;
  auVar118 = vmaxps_avx512vl(auVar118,auVar117);
  auVar115 = vmaxps_avx(auVar115,auVar118);
  auVar118._8_4_ = 0x3f7ffffa;
  auVar118._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar118._12_4_ = 0x3f7ffffa;
  auVar118._16_4_ = 0x3f7ffffa;
  auVar118._20_4_ = 0x3f7ffffa;
  auVar118._24_4_ = 0x3f7ffffa;
  auVar118._28_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar115,auVar118);
  auVar222 = ZEXT3264(local_560);
  auVar115 = vpmaxsd_avx2(auVar107,auVar122);
  auVar118 = vpmaxsd_avx2(auVar108,auVar121);
  auVar115 = vminps_avx(auVar115,auVar118);
  auVar118 = vpmaxsd_avx2(auVar119,auVar120);
  uVar168 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar116._4_4_ = uVar168;
  auVar116._0_4_ = uVar168;
  auVar116._8_4_ = uVar168;
  auVar116._12_4_ = uVar168;
  auVar116._16_4_ = uVar168;
  auVar116._20_4_ = uVar168;
  auVar116._24_4_ = uVar168;
  auVar116._28_4_ = uVar168;
  auVar118 = vminps_avx512vl(auVar118,auVar116);
  auVar115 = vminps_avx(auVar115,auVar118);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar115 = vmulps_avx512vl(auVar115,auVar112);
  uVar169 = vcmpps_avx512vl(local_560,auVar115,2);
  uVar29 = vpcmpgtd_avx512vl(auVar101,_DAT_01fb4ba0);
  local_5e8 = (ulong)(byte)((byte)uVar169 & (byte)uVar29);
  local_5f0 = pre->ray_space + k;
  local_630 = (undefined1 (*) [32])&local_160;
  local_320 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_628 = pre;
  do {
    auVar115 = local_5c0;
    if (local_5e8 == 0) {
      return;
    }
    lVar87 = 0;
    for (uVar85 = local_5e8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      lVar87 = lVar87 + 1;
    }
    uVar13 = *(uint *)(prim + 2);
    uVar83 = *(uint *)(prim + lVar87 * 4 + 6);
    uVar85 = (ulong)uVar83;
    pGVar86 = (context->scene->geometries).items[uVar13].ptr;
    uVar81 = (ulong)*(uint *)(*(long *)&pGVar86->field_0x58 +
                             uVar85 * pGVar86[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar172 = (pGVar86->time_range).lower;
    fVar172 = pGVar86->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar172) / ((pGVar86->time_range).upper - fVar172))
    ;
    auVar94 = vroundss_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),9);
    auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar86->fnumTimeSegments + -1.0)));
    auVar94 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
    fVar172 = fVar172 - auVar94._0_4_;
    fVar27 = 1.0 - fVar172;
    _Var16 = pGVar86[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar88 = (long)(int)auVar94._0_4_ * 0x38;
    lVar84 = *(long *)(_Var16 + 0x10 + lVar88);
    lVar17 = *(long *)(_Var16 + 0x38 + lVar88);
    lVar18 = *(long *)(_Var16 + 0x48 + lVar88);
    auVar156._4_4_ = fVar172;
    auVar156._0_4_ = fVar172;
    auVar156._8_4_ = fVar172;
    auVar156._12_4_ = fVar172;
    pfVar3 = (float *)(lVar17 + lVar18 * uVar81);
    auVar95._0_4_ = fVar172 * *pfVar3;
    auVar95._4_4_ = fVar172 * pfVar3[1];
    auVar95._8_4_ = fVar172 * pfVar3[2];
    auVar95._12_4_ = fVar172 * pfVar3[3];
    lVar87 = uVar81 + 1;
    auVar94 = vmulps_avx512vl(auVar156,*(undefined1 (*) [16])(lVar17 + lVar18 * lVar87));
    p_Var19 = pGVar86[4].occlusionFilterN;
    auVar97._4_4_ = fVar27;
    auVar97._0_4_ = fVar27;
    auVar97._8_4_ = fVar27;
    auVar97._12_4_ = fVar27;
    auVar7 = vfmadd231ps_fma(auVar95,auVar97,
                             *(undefined1 (*) [16])(*(long *)(_Var16 + lVar88) + lVar84 * uVar81));
    auVar95 = vfmadd231ps_avx512vl
                        (auVar94,auVar97,
                         *(undefined1 (*) [16])(*(long *)(_Var16 + lVar88) + lVar84 * lVar87));
    pfVar3 = (float *)(*(long *)(p_Var19 + lVar88 + 0x38) +
                      uVar81 * *(long *)(p_Var19 + lVar88 + 0x48));
    auVar216._0_4_ = fVar172 * *pfVar3;
    auVar216._4_4_ = fVar172 * pfVar3[1];
    auVar216._8_4_ = fVar172 * pfVar3[2];
    auVar216._12_4_ = fVar172 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var19 + lVar88 + 0x38) +
                      *(long *)(p_Var19 + lVar88 + 0x48) * lVar87);
    auVar217._0_4_ = fVar172 * *pfVar3;
    auVar217._4_4_ = fVar172 * pfVar3[1];
    auVar217._8_4_ = fVar172 * pfVar3[2];
    auVar217._12_4_ = fVar172 * pfVar3[3];
    auVar93 = vfmadd231ps_fma(auVar216,auVar97,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var19 + lVar88) +
                               *(long *)(p_Var19 + lVar88 + 0x10) * uVar81));
    auVar6 = vfmadd231ps_fma(auVar217,auVar97,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var19 + lVar88) +
                              *(long *)(p_Var19 + lVar88 + 0x10) * lVar87));
    auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    iVar14 = (int)pGVar86[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar96._8_4_ = 0xbeaaaaab;
    auVar96._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar96._12_4_ = 0xbeaaaaab;
    auVar156 = vfnmadd213ps_fma(auVar93,auVar96,auVar7);
    auVar96 = vfmadd213ps_avx512vl(auVar6,auVar96,auVar95);
    auVar6 = vsubps_avx(auVar7,auVar94);
    uVar168 = auVar6._0_4_;
    auVar98._4_4_ = uVar168;
    auVar98._0_4_ = uVar168;
    auVar98._8_4_ = uVar168;
    auVar98._12_4_ = uVar168;
    auVar93 = vshufps_avx(auVar6,auVar6,0x55);
    aVar4 = (local_5f0->vx).field_0;
    aVar5 = (local_5f0->vy).field_0;
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    fVar172 = (local_5f0->vz).field_0.m128[0];
    fVar27 = *(float *)((long)&(local_5f0->vz).field_0 + 4);
    fVar70 = *(float *)((long)&(local_5f0->vz).field_0 + 8);
    fVar71 = *(float *)((long)&(local_5f0->vz).field_0 + 0xc);
    auVar207._0_4_ = fVar172 * auVar6._0_4_;
    auVar207._4_4_ = fVar27 * auVar6._4_4_;
    auVar207._8_4_ = fVar70 * auVar6._8_4_;
    auVar207._12_4_ = fVar71 * auVar6._12_4_;
    auVar93 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar93);
    auVar8 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar98);
    auVar6 = vsubps_avx(auVar156,auVar94);
    uVar168 = auVar6._0_4_;
    auVar99._4_4_ = uVar168;
    auVar99._0_4_ = uVar168;
    auVar99._8_4_ = uVar168;
    auVar99._12_4_ = uVar168;
    auVar93 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar210._0_4_ = fVar172 * auVar6._0_4_;
    auVar210._4_4_ = fVar27 * auVar6._4_4_;
    auVar210._8_4_ = fVar70 * auVar6._8_4_;
    auVar210._12_4_ = fVar71 * auVar6._12_4_;
    auVar93 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar5,auVar93);
    auVar9 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar99);
    auVar6 = vsubps_avx(auVar96,auVar94);
    uVar168 = auVar6._0_4_;
    auVar100._4_4_ = uVar168;
    auVar100._0_4_ = uVar168;
    auVar100._8_4_ = uVar168;
    auVar100._12_4_ = uVar168;
    auVar93 = vshufps_avx(auVar6,auVar6,0x55);
    auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
    auVar212._0_4_ = fVar172 * auVar6._0_4_;
    auVar212._4_4_ = fVar27 * auVar6._4_4_;
    auVar212._8_4_ = fVar70 * auVar6._8_4_;
    auVar212._12_4_ = fVar71 * auVar6._12_4_;
    auVar93 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar93);
    auVar6 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar100);
    auVar93 = vsubps_avx512vl(auVar95,auVar94);
    uVar168 = auVar93._0_4_;
    auVar180._4_4_ = uVar168;
    auVar180._0_4_ = uVar168;
    auVar180._8_4_ = uVar168;
    auVar180._12_4_ = uVar168;
    auVar94 = vshufps_avx(auVar93,auVar93,0x55);
    auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar215._0_4_ = fVar172 * auVar93._0_4_;
    auVar215._4_4_ = fVar27 * auVar93._4_4_;
    auVar215._8_4_ = fVar70 * auVar93._8_4_;
    auVar215._12_4_ = fVar71 * auVar93._12_4_;
    auVar94 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar5,auVar94);
    lVar87 = (long)iVar14 * 0x44;
    auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar87);
    auVar10 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar180);
    uVar168 = auVar8._0_4_;
    local_460._4_4_ = uVar168;
    local_460._0_4_ = uVar168;
    local_460._8_4_ = uVar168;
    local_460._12_4_ = uVar168;
    local_460._16_4_ = uVar168;
    local_460._20_4_ = uVar168;
    local_460._24_4_ = uVar168;
    local_460._28_4_ = uVar168;
    auVar101._8_4_ = 1;
    auVar101._0_8_ = 0x100000001;
    auVar101._12_4_ = 1;
    auVar101._16_4_ = 1;
    auVar101._20_4_ = 1;
    auVar101._24_4_ = 1;
    auVar101._28_4_ = 1;
    local_480 = vpermps_avx2(auVar101,ZEXT1632(auVar8));
    auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x484);
    uVar168 = auVar9._0_4_;
    auVar181._4_4_ = uVar168;
    auVar181._0_4_ = uVar168;
    auVar181._8_4_ = uVar168;
    auVar181._12_4_ = uVar168;
    local_4a0._16_4_ = uVar168;
    local_4a0._0_16_ = auVar181;
    local_4a0._20_4_ = uVar168;
    local_4a0._24_4_ = uVar168;
    local_4a0._28_4_ = uVar168;
    local_4c0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar9));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x908);
    local_4e0 = vbroadcastss_avx512vl(auVar6);
    auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0xd8c);
    local_500 = vpermps_avx512vl(auVar101,ZEXT1632(auVar6));
    uVar168 = auVar10._0_4_;
    local_520._4_4_ = uVar168;
    local_520._0_4_ = uVar168;
    fStack_518 = (float)uVar168;
    fStack_514 = (float)uVar168;
    fStack_510 = (float)uVar168;
    fStack_50c = (float)uVar168;
    fStack_508 = (float)uVar168;
    register0x0000139c = uVar168;
    _local_540 = vpermps_avx512vl(auVar101,ZEXT1632(auVar10));
    auVar113 = vmulps_avx512vl(_local_520,auVar112);
    auVar114 = vmulps_avx512vl(_local_540,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_4e0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_500);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar117,local_4a0);
    auVar119 = vfmadd231ps_avx512vl(auVar114,auVar117,local_4c0);
    auVar120 = vfmadd231ps_avx512vl(auVar113,auVar118,local_460);
    auVar202 = ZEXT3264(auVar120);
    auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar87);
    auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x484);
    auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x908);
    auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0xd8c);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar118,local_480);
    auVar193 = ZEXT3264(auVar119);
    auVar121 = vmulps_avx512vl(_local_520,auVar108);
    auVar122 = vmulps_avx512vl(_local_540,auVar108);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar107,local_4e0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar107,local_500);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_4a0);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar114,local_4c0);
    auVar11 = vfmadd231ps_fma(auVar121,auVar113,local_460);
    auVar204 = ZEXT1664(auVar11);
    auVar12 = vfmadd231ps_fma(auVar122,auVar113,local_480);
    auVar121 = vsubps_avx512vl(ZEXT1632(auVar11),auVar120);
    auVar122 = vsubps_avx512vl(ZEXT1632(auVar12),auVar119);
    auVar101 = vmulps_avx512vl(auVar119,auVar121);
    auVar102 = vmulps_avx512vl(auVar120,auVar122);
    auVar101 = vsubps_avx512vl(auVar101,auVar102);
    auVar94 = vshufps_avx(auVar7,auVar7,0xff);
    uVar169 = auVar94._0_8_;
    local_80._8_8_ = uVar169;
    local_80._0_8_ = uVar169;
    local_80._16_8_ = uVar169;
    local_80._24_8_ = uVar169;
    auVar94 = vshufps_avx(auVar156,auVar156,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar94);
    auVar94 = vshufps_avx(auVar96,auVar96,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar94);
    auVar94 = vshufps_avx512vl(auVar95,auVar95,0xff);
    uVar169 = auVar94._0_8_;
    local_e0._8_8_ = uVar169;
    local_e0._0_8_ = uVar169;
    local_e0._16_8_ = uVar169;
    local_e0._24_8_ = uVar169;
    auVar102 = vmulps_avx512vl(local_e0,auVar112);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar116,local_c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar117,local_a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar118,local_80);
    auVar103 = vmulps_avx512vl(local_e0,auVar108);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_c0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_a0);
    auVar218 = vfmadd231ps_fma(auVar103,auVar113,local_80);
    auVar103 = vmulps_avx512vl(auVar122,auVar122);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar121,auVar121);
    auVar104 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar218));
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    uVar169 = vcmpps_avx512vl(auVar101,auVar103,2);
    auVar94 = vblendps_avx(auVar8,auVar7,8);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar93 = vandps_avx512vl(auVar94,auVar97);
    auVar94 = vblendps_avx(auVar9,auVar156,8);
    auVar94 = vandps_avx512vl(auVar94,auVar97);
    auVar93 = vmaxps_avx(auVar93,auVar94);
    auVar94 = vblendps_avx(auVar6,auVar96,8);
    auVar98 = vandps_avx512vl(auVar94,auVar97);
    auVar94 = vblendps_avx(auVar10,auVar95,8);
    auVar94 = vandps_avx512vl(auVar94,auVar97);
    auVar94 = vmaxps_avx(auVar98,auVar94);
    auVar94 = vmaxps_avx(auVar93,auVar94);
    auVar93 = vmovshdup_avx(auVar94);
    auVar93 = vmaxss_avx(auVar93,auVar94);
    auVar94 = vshufpd_avx(auVar94,auVar94,1);
    auVar94 = vmaxss_avx(auVar94,auVar93);
    auVar110._0_4_ = (float)iVar14;
    local_5c0._4_12_ = auVar96._4_12_;
    local_5c0._0_4_ = auVar110._0_4_;
    local_5c0._16_16_ = auVar115._16_16_;
    auVar110._4_4_ = auVar110._0_4_;
    auVar110._8_4_ = auVar110._0_4_;
    auVar110._12_4_ = auVar110._0_4_;
    auVar110._16_4_ = auVar110._0_4_;
    auVar110._20_4_ = auVar110._0_4_;
    auVar110._24_4_ = auVar110._0_4_;
    auVar110._28_4_ = auVar110._0_4_;
    uVar29 = vcmpps_avx512vl(auVar110,_DAT_01f7b060,0xe);
    bVar89 = (byte)uVar169 & (byte)uVar29;
    fVar172 = auVar94._0_4_ * 4.7683716e-07;
    local_640 = ZEXT416((uint)fVar172);
    auVar111._8_4_ = 2;
    auVar111._0_8_ = 0x200000002;
    auVar111._12_4_ = 2;
    auVar111._16_4_ = 2;
    auVar111._20_4_ = 2;
    auVar111._24_4_ = 2;
    auVar111._28_4_ = 2;
    local_260 = vpermps_avx2(auVar111,ZEXT1632(auVar8));
    local_280 = vpermps_avx2(auVar111,ZEXT1632(auVar9));
    local_2a0 = vpermps_avx2(auVar111,ZEXT1632(auVar6));
    local_2c0 = vpermps_avx2(auVar111,ZEXT1632(auVar10));
    local_580 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_57c = 0;
    uStack_578 = 0;
    uStack_574 = 0;
    local_2e0 = vpbroadcastd_avx512vl();
    local_300 = vpbroadcastd_avx512vl();
    local_680 = auVar7._0_8_;
    uStack_678 = auVar7._8_8_;
    local_6a0 = auVar156._0_8_;
    uStack_698 = auVar156._8_8_;
    local_6b0 = auVar96._0_8_;
    uStack_6a8 = auVar96._8_8_;
    local_690._0_4_ = auVar95._0_4_;
    fVar27 = (float)local_690;
    local_690._4_4_ = auVar95._4_4_;
    fVar70 = local_690._4_4_;
    uStack_688._0_4_ = auVar95._8_4_;
    fVar71 = (float)uStack_688;
    uStack_688._4_4_ = auVar95._12_4_;
    fVar79 = uStack_688._4_4_;
    local_690 = auVar95._0_8_;
    uStack_688 = auVar95._8_8_;
    if (bVar89 != 0) {
      auVar115 = vmulps_avx512vl(local_2c0,auVar108);
      auVar115 = vfmadd213ps_avx512vl(auVar107,local_2a0,auVar115);
      auVar115 = vfmadd213ps_avx512vl(auVar114,local_280,auVar115);
      auVar113 = vfmadd213ps_avx512vl(auVar113,local_260,auVar115);
      auVar115 = vmulps_avx512vl(local_2c0,auVar112);
      auVar115 = vfmadd213ps_avx512vl(auVar116,local_2a0,auVar115);
      auVar114 = vfmadd213ps_avx512vl(auVar117,local_280,auVar115);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1210);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1694);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1b18);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 + 0x1f9c);
      auVar114 = vfmadd213ps_avx512vl(auVar118,local_260,auVar114);
      auVar118 = vmulps_avx512vl(_local_520,auVar112);
      auVar107 = vmulps_avx512vl(_local_540,auVar112);
      auVar112 = vmulps_avx512vl(local_2c0,auVar112);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_4e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_500);
      auVar116 = vfmadd231ps_avx512vl(auVar112,local_2a0,auVar116);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,local_4a0);
      auVar112 = vfmadd231ps_avx512vl(auVar107,auVar117,local_4c0);
      auVar107 = vfmadd231ps_avx512vl(auVar116,local_280,auVar117);
      auVar94 = vfmadd231ps_fma(auVar118,auVar115,local_460);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_480);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1210);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1b18);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1f9c);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_260,auVar115);
      auVar115 = vmulps_avx512vl(_local_520,auVar116);
      auVar108 = vmulps_avx512vl(_local_540,auVar116);
      auVar116 = vmulps_avx512vl(local_2c0,auVar116);
      auVar101 = vfmadd231ps_avx512vl(auVar115,auVar117,local_4e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_500);
      auVar117 = vfmadd231ps_avx512vl(auVar116,local_2a0,auVar117);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 + 0x1694);
      auVar116 = vfmadd231ps_avx512vl(auVar101,auVar115,local_4a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_4c0);
      auVar115 = vfmadd231ps_avx512vl(auVar117,local_280,auVar115);
      auVar93 = vfmadd231ps_fma(auVar116,auVar118,local_460);
      auVar117 = vfmadd231ps_avx512vl(auVar108,auVar118,local_480);
      auVar116 = vfmadd231ps_avx512vl(auVar115,local_260,auVar118);
      auVar222 = ZEXT3264(auVar222._0_32_);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar221 = ZEXT3264(auVar108);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar219._16_4_ = 0x7fffffff;
      auVar219._20_4_ = 0x7fffffff;
      auVar219._24_4_ = 0x7fffffff;
      auVar219._28_4_ = 0x7fffffff;
      auVar115 = vandps_avx(ZEXT1632(auVar94),auVar219);
      auVar118 = vandps_avx(auVar112,auVar219);
      auVar118 = vmaxps_avx(auVar115,auVar118);
      auVar115 = vandps_avx(auVar107,auVar219);
      auVar115 = vmaxps_avx(auVar118,auVar115);
      auVar214._4_4_ = fVar172;
      auVar214._0_4_ = fVar172;
      auVar214._8_4_ = fVar172;
      auVar214._12_4_ = fVar172;
      auVar214._16_4_ = fVar172;
      auVar214._20_4_ = fVar172;
      auVar214._24_4_ = fVar172;
      auVar214._28_4_ = fVar172;
      uVar81 = vcmpps_avx512vl(auVar115,auVar214,1);
      bVar20 = (bool)((byte)uVar81 & 1);
      auVar123._0_4_ = (float)((uint)bVar20 * auVar121._0_4_ | (uint)!bVar20 * auVar94._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar20 * auVar121._4_4_ | (uint)!bVar20 * auVar94._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar20 * auVar121._8_4_ | (uint)!bVar20 * auVar94._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar20 * auVar121._12_4_ | (uint)!bVar20 * auVar94._12_4_);
      fVar208 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar121._16_4_);
      auVar123._16_4_ = fVar208;
      fVar206 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar121._20_4_);
      auVar123._20_4_ = fVar206;
      fVar209 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar121._24_4_);
      auVar123._24_4_ = fVar209;
      uVar82 = (uint)(byte)(uVar81 >> 7) * auVar121._28_4_;
      auVar123._28_4_ = uVar82;
      bVar20 = (bool)((byte)uVar81 & 1);
      auVar124._0_4_ = (float)((uint)bVar20 * auVar122._0_4_ | (uint)!bVar20 * auVar112._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar20 * auVar122._4_4_ | (uint)!bVar20 * auVar112._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar20 * auVar122._8_4_ | (uint)!bVar20 * auVar112._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar20 * auVar122._12_4_ | (uint)!bVar20 * auVar112._12_4_);
      bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar20 * auVar122._16_4_ | (uint)!bVar20 * auVar112._16_4_);
      bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar20 * auVar122._20_4_ | (uint)!bVar20 * auVar112._20_4_);
      bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar20 * auVar122._24_4_ | (uint)!bVar20 * auVar112._24_4_);
      bVar20 = SUB81(uVar81 >> 7,0);
      auVar124._28_4_ = (uint)bVar20 * auVar122._28_4_ | (uint)!bVar20 * auVar112._28_4_;
      auVar115 = vandps_avx(auVar219,ZEXT1632(auVar93));
      auVar118 = vandps_avx(auVar117,auVar219);
      auVar118 = vmaxps_avx(auVar115,auVar118);
      auVar115 = vandps_avx(auVar116,auVar219);
      auVar115 = vmaxps_avx(auVar118,auVar115);
      uVar81 = vcmpps_avx512vl(auVar115,auVar214,1);
      bVar20 = (bool)((byte)uVar81 & 1);
      auVar125._0_4_ = (float)((uint)bVar20 * auVar121._0_4_ | (uint)!bVar20 * auVar93._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar125._4_4_ = (float)((uint)bVar20 * auVar121._4_4_ | (uint)!bVar20 * auVar93._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar125._8_4_ = (float)((uint)bVar20 * auVar121._8_4_ | (uint)!bVar20 * auVar93._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar125._12_4_ = (float)((uint)bVar20 * auVar121._12_4_ | (uint)!bVar20 * auVar93._12_4_);
      fVar179 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar121._16_4_);
      auVar125._16_4_ = fVar179;
      fVar171 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar121._20_4_);
      auVar125._20_4_ = fVar171;
      fVar178 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar121._24_4_);
      auVar125._24_4_ = fVar178;
      auVar125._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar121._28_4_;
      bVar20 = (bool)((byte)uVar81 & 1);
      auVar126._0_4_ = (float)((uint)bVar20 * auVar122._0_4_ | (uint)!bVar20 * auVar117._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar126._4_4_ = (float)((uint)bVar20 * auVar122._4_4_ | (uint)!bVar20 * auVar117._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar126._8_4_ = (float)((uint)bVar20 * auVar122._8_4_ | (uint)!bVar20 * auVar117._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar126._12_4_ = (float)((uint)bVar20 * auVar122._12_4_ | (uint)!bVar20 * auVar117._12_4_);
      bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar126._16_4_ = (float)((uint)bVar20 * auVar122._16_4_ | (uint)!bVar20 * auVar117._16_4_);
      bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar126._20_4_ = (float)((uint)bVar20 * auVar122._20_4_ | (uint)!bVar20 * auVar117._20_4_);
      bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar126._24_4_ = (float)((uint)bVar20 * auVar122._24_4_ | (uint)!bVar20 * auVar117._24_4_);
      bVar20 = SUB81(uVar81 >> 7,0);
      auVar126._28_4_ = (uint)bVar20 * auVar122._28_4_ | (uint)!bVar20 * auVar117._28_4_;
      auVar99 = vxorps_avx512vl(auVar181,auVar181);
      auVar115 = vfmadd213ps_avx512vl(auVar123,auVar123,ZEXT1632(auVar99));
      auVar94 = vfmadd231ps_fma(auVar115,auVar124,auVar124);
      auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
      fVar91 = auVar115._0_4_;
      fVar92 = auVar115._4_4_;
      fVar148 = auVar115._8_4_;
      fVar149 = auVar115._12_4_;
      fVar150 = auVar115._16_4_;
      fVar151 = auVar115._20_4_;
      fVar152 = auVar115._24_4_;
      auVar37._4_4_ = fVar92 * fVar92 * fVar92 * auVar94._4_4_ * -0.5;
      auVar37._0_4_ = fVar91 * fVar91 * fVar91 * auVar94._0_4_ * -0.5;
      auVar37._8_4_ = fVar148 * fVar148 * fVar148 * auVar94._8_4_ * -0.5;
      auVar37._12_4_ = fVar149 * fVar149 * fVar149 * auVar94._12_4_ * -0.5;
      auVar37._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
      auVar37._20_4_ = fVar151 * fVar151 * fVar151 * -0.0;
      auVar37._24_4_ = fVar152 * fVar152 * fVar152 * -0.0;
      auVar37._28_4_ = 0;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar117 = vfmadd231ps_avx512vl(auVar37,auVar118,auVar115);
      auVar38._4_4_ = auVar124._4_4_ * auVar117._4_4_;
      auVar38._0_4_ = auVar124._0_4_ * auVar117._0_4_;
      auVar38._8_4_ = auVar124._8_4_ * auVar117._8_4_;
      auVar38._12_4_ = auVar124._12_4_ * auVar117._12_4_;
      auVar38._16_4_ = auVar124._16_4_ * auVar117._16_4_;
      auVar38._20_4_ = auVar124._20_4_ * auVar117._20_4_;
      auVar38._24_4_ = auVar124._24_4_ * auVar117._24_4_;
      auVar38._28_4_ = auVar115._28_4_;
      auVar39._4_4_ = auVar117._4_4_ * -auVar123._4_4_;
      auVar39._0_4_ = auVar117._0_4_ * -auVar123._0_4_;
      auVar39._8_4_ = auVar117._8_4_ * -auVar123._8_4_;
      auVar39._12_4_ = auVar117._12_4_ * -auVar123._12_4_;
      auVar39._16_4_ = auVar117._16_4_ * -fVar208;
      auVar39._20_4_ = auVar117._20_4_ * -fVar206;
      auVar39._24_4_ = auVar117._24_4_ * -fVar209;
      auVar39._28_4_ = uVar82 ^ 0x80000000;
      auVar115 = vmulps_avx512vl(auVar117,ZEXT1632(auVar99));
      auVar121 = ZEXT1632(auVar99);
      auVar116 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar121);
      auVar94 = vfmadd231ps_fma(auVar116,auVar126,auVar126);
      auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
      fVar206 = auVar116._0_4_;
      fVar208 = auVar116._4_4_;
      fVar209 = auVar116._8_4_;
      fVar91 = auVar116._12_4_;
      fVar92 = auVar116._16_4_;
      fVar148 = auVar116._20_4_;
      fVar149 = auVar116._24_4_;
      auVar40._4_4_ = fVar208 * fVar208 * fVar208 * auVar94._4_4_ * -0.5;
      auVar40._0_4_ = fVar206 * fVar206 * fVar206 * auVar94._0_4_ * -0.5;
      auVar40._8_4_ = fVar209 * fVar209 * fVar209 * auVar94._8_4_ * -0.5;
      auVar40._12_4_ = fVar91 * fVar91 * fVar91 * auVar94._12_4_ * -0.5;
      auVar40._16_4_ = fVar92 * fVar92 * fVar92 * -0.0;
      auVar40._20_4_ = fVar148 * fVar148 * fVar148 * -0.0;
      auVar40._24_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar40._28_4_ = 0;
      auVar118 = vfmadd231ps_avx512vl(auVar40,auVar118,auVar116);
      auVar41._4_4_ = auVar126._4_4_ * auVar118._4_4_;
      auVar41._0_4_ = auVar126._0_4_ * auVar118._0_4_;
      auVar41._8_4_ = auVar126._8_4_ * auVar118._8_4_;
      auVar41._12_4_ = auVar126._12_4_ * auVar118._12_4_;
      auVar41._16_4_ = auVar126._16_4_ * auVar118._16_4_;
      auVar41._20_4_ = auVar126._20_4_ * auVar118._20_4_;
      auVar41._24_4_ = auVar126._24_4_ * auVar118._24_4_;
      auVar41._28_4_ = auVar116._28_4_;
      auVar42._4_4_ = -auVar125._4_4_ * auVar118._4_4_;
      auVar42._0_4_ = -auVar125._0_4_ * auVar118._0_4_;
      auVar42._8_4_ = -auVar125._8_4_ * auVar118._8_4_;
      auVar42._12_4_ = -auVar125._12_4_ * auVar118._12_4_;
      auVar42._16_4_ = -fVar179 * auVar118._16_4_;
      auVar42._20_4_ = -fVar171 * auVar118._20_4_;
      auVar42._24_4_ = -fVar178 * auVar118._24_4_;
      auVar42._28_4_ = auVar117._28_4_;
      auVar118 = vmulps_avx512vl(auVar118,auVar121);
      auVar94 = vfmadd213ps_fma(auVar38,auVar102,auVar120);
      auVar93 = vfmadd213ps_fma(auVar39,auVar102,auVar119);
      auVar117 = vfmadd213ps_avx512vl(auVar115,auVar102,auVar114);
      auVar116 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar218),ZEXT1632(auVar11));
      auVar95 = vfnmadd213ps_fma(auVar38,auVar102,auVar120);
      auVar107 = ZEXT1632(auVar218);
      auVar6 = vfmadd213ps_fma(auVar42,auVar107,ZEXT1632(auVar12));
      auVar97 = vfnmadd213ps_fma(auVar39,auVar102,auVar119);
      auVar8 = vfmadd213ps_fma(auVar118,auVar107,auVar113);
      auVar112 = vfnmadd231ps_avx512vl(auVar114,auVar102,auVar115);
      auVar11 = vfnmadd213ps_fma(auVar41,auVar107,ZEXT1632(auVar11));
      auVar12 = vfnmadd213ps_fma(auVar42,auVar107,ZEXT1632(auVar12));
      auVar98 = vfnmadd231ps_fma(auVar113,ZEXT1632(auVar218),auVar118);
      auVar118 = vsubps_avx512vl(auVar116,ZEXT1632(auVar95));
      auVar115 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar97));
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar8),auVar112);
      auVar114 = vmulps_avx512vl(auVar115,auVar112);
      auVar9 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar97),auVar113);
      auVar43._4_4_ = auVar95._4_4_ * auVar113._4_4_;
      auVar43._0_4_ = auVar95._0_4_ * auVar113._0_4_;
      auVar43._8_4_ = auVar95._8_4_ * auVar113._8_4_;
      auVar43._12_4_ = auVar95._12_4_ * auVar113._12_4_;
      auVar43._16_4_ = auVar113._16_4_ * 0.0;
      auVar43._20_4_ = auVar113._20_4_ * 0.0;
      auVar43._24_4_ = auVar113._24_4_ * 0.0;
      auVar43._28_4_ = auVar113._28_4_;
      auVar113 = vfmsub231ps_avx512vl(auVar43,auVar112,auVar118);
      auVar44._4_4_ = auVar97._4_4_ * auVar118._4_4_;
      auVar44._0_4_ = auVar97._0_4_ * auVar118._0_4_;
      auVar44._8_4_ = auVar97._8_4_ * auVar118._8_4_;
      auVar44._12_4_ = auVar97._12_4_ * auVar118._12_4_;
      auVar44._16_4_ = auVar118._16_4_ * 0.0;
      auVar44._20_4_ = auVar118._20_4_ * 0.0;
      auVar44._24_4_ = auVar118._24_4_ * 0.0;
      auVar44._28_4_ = auVar118._28_4_;
      auVar10 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar95),auVar115);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar121,auVar113);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar121,ZEXT1632(auVar9));
      auVar122 = ZEXT1632(auVar99);
      uVar81 = vcmpps_avx512vl(auVar115,auVar122,2);
      bVar80 = (byte)uVar81;
      fVar91 = (float)((uint)(bVar80 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar11._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar148 = (float)((uint)bVar20 * auVar94._4_4_ | (uint)!bVar20 * auVar11._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar150 = (float)((uint)bVar20 * auVar94._8_4_ | (uint)!bVar20 * auVar11._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar152 = (float)((uint)bVar20 * auVar94._12_4_ | (uint)!bVar20 * auVar11._12_4_);
      auVar114 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar91))));
      fVar92 = (float)((uint)(bVar80 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar12._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar149 = (float)((uint)bVar20 * auVar93._4_4_ | (uint)!bVar20 * auVar12._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar151 = (float)((uint)bVar20 * auVar93._8_4_ | (uint)!bVar20 * auVar12._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar153 = (float)((uint)bVar20 * auVar93._12_4_ | (uint)!bVar20 * auVar12._12_4_);
      auVar107 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar92))));
      auVar127._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar98._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar20 * auVar117._4_4_ | (uint)!bVar20 * auVar98._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar20 * auVar117._8_4_ | (uint)!bVar20 * auVar98._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar20 * auVar117._12_4_ | (uint)!bVar20 * auVar98._12_4_);
      fVar206 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
      auVar127._16_4_ = fVar206;
      fVar208 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
      auVar127._20_4_ = fVar208;
      fVar209 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
      auVar127._24_4_ = fVar209;
      iVar1 = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
      auVar127._28_4_ = iVar1;
      auVar118 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar116);
      auVar128._0_4_ =
           (uint)(bVar80 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar93._0_4_;
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar20 * auVar118._4_4_ | (uint)!bVar20 * auVar93._4_4_;
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar20 * auVar118._8_4_ | (uint)!bVar20 * auVar93._8_4_;
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar20 * auVar118._12_4_ | (uint)!bVar20 * auVar93._12_4_;
      auVar128._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar118._16_4_;
      auVar128._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar118._20_4_;
      auVar128._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar118._24_4_;
      auVar128._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar118._28_4_;
      auVar118 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar6));
      auVar129._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar9._0_4_);
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar129._4_4_ = (float)((uint)bVar20 * auVar118._4_4_ | (uint)!bVar20 * auVar9._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar129._8_4_ = (float)((uint)bVar20 * auVar118._8_4_ | (uint)!bVar20 * auVar9._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar129._12_4_ = (float)((uint)bVar20 * auVar118._12_4_ | (uint)!bVar20 * auVar9._12_4_);
      fVar179 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar118._16_4_);
      auVar129._16_4_ = fVar179;
      fVar171 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar118._20_4_);
      auVar129._20_4_ = fVar171;
      fVar178 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar118._24_4_);
      auVar129._24_4_ = fVar178;
      auVar129._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar118._28_4_;
      auVar118 = vblendmps_avx512vl(auVar112,ZEXT1632(auVar8));
      auVar130._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar117._0_4_)
      ;
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar130._4_4_ = (float)((uint)bVar20 * auVar118._4_4_ | (uint)!bVar20 * auVar117._4_4_);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar130._8_4_ = (float)((uint)bVar20 * auVar118._8_4_ | (uint)!bVar20 * auVar117._8_4_);
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar130._12_4_ = (float)((uint)bVar20 * auVar118._12_4_ | (uint)!bVar20 * auVar117._12_4_);
      bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar130._16_4_ = (float)((uint)bVar20 * auVar118._16_4_ | (uint)!bVar20 * auVar117._16_4_);
      bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar130._20_4_ = (float)((uint)bVar20 * auVar118._20_4_ | (uint)!bVar20 * auVar117._20_4_);
      bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar130._24_4_ = (float)((uint)bVar20 * auVar118._24_4_ | (uint)!bVar20 * auVar117._24_4_);
      bVar20 = SUB81(uVar81 >> 7,0);
      auVar130._28_4_ = (uint)bVar20 * auVar118._28_4_ | (uint)!bVar20 * auVar117._28_4_;
      auVar131._0_4_ =
           (uint)(bVar80 & 1) * (int)auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar116._0_4_;
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar20 * (int)auVar95._4_4_ | (uint)!bVar20 * auVar116._4_4_;
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar20 * (int)auVar95._8_4_ | (uint)!bVar20 * auVar116._8_4_;
      bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar20 * (int)auVar95._12_4_ | (uint)!bVar20 * auVar116._12_4_;
      auVar131._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_;
      auVar131._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_;
      auVar131._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_;
      auVar131._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar116._28_4_;
      bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar22 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar23 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar132._0_4_ =
           (uint)(bVar80 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar8._0_4_;
      bVar21 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar21 * auVar112._4_4_ | (uint)!bVar21 * auVar8._4_4_;
      bVar21 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar21 * auVar112._8_4_ | (uint)!bVar21 * auVar8._8_4_;
      bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar21 * auVar112._12_4_ | (uint)!bVar21 * auVar8._12_4_;
      auVar132._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar112._16_4_;
      auVar132._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar112._20_4_;
      auVar132._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar112._24_4_;
      iVar2 = (uint)(byte)(uVar81 >> 7) * auVar112._28_4_;
      auVar132._28_4_ = iVar2;
      auVar119 = vsubps_avx512vl(auVar131,auVar114);
      auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar97._12_4_ |
                                               (uint)!bVar23 * auVar6._12_4_,
                                               CONCAT48((uint)bVar22 * (int)auVar97._8_4_ |
                                                        (uint)!bVar22 * auVar6._8_4_,
                                                        CONCAT44((uint)bVar20 * (int)auVar97._4_4_ |
                                                                 (uint)!bVar20 * auVar6._4_4_,
                                                                 (uint)(bVar80 & 1) *
                                                                 (int)auVar97._0_4_ |
                                                                 (uint)!(bool)(bVar80 & 1) *
                                                                 auVar6._0_4_)))),auVar107);
      auVar202 = ZEXT3264(auVar118);
      auVar117 = vsubps_avx(auVar132,auVar127);
      auVar116 = vsubps_avx(auVar114,auVar128);
      auVar204 = ZEXT3264(auVar116);
      auVar112 = vsubps_avx(auVar107,auVar129);
      auVar113 = vsubps_avx(auVar127,auVar130);
      auVar45._4_4_ = auVar117._4_4_ * fVar148;
      auVar45._0_4_ = auVar117._0_4_ * fVar91;
      auVar45._8_4_ = auVar117._8_4_ * fVar150;
      auVar45._12_4_ = auVar117._12_4_ * fVar152;
      auVar45._16_4_ = auVar117._16_4_ * 0.0;
      auVar45._20_4_ = auVar117._20_4_ * 0.0;
      auVar45._24_4_ = auVar117._24_4_ * 0.0;
      auVar45._28_4_ = iVar2;
      auVar94 = vfmsub231ps_fma(auVar45,auVar127,auVar119);
      auVar46._4_4_ = fVar149 * auVar119._4_4_;
      auVar46._0_4_ = fVar92 * auVar119._0_4_;
      auVar46._8_4_ = fVar151 * auVar119._8_4_;
      auVar46._12_4_ = fVar153 * auVar119._12_4_;
      auVar46._16_4_ = auVar119._16_4_ * 0.0;
      auVar46._20_4_ = auVar119._20_4_ * 0.0;
      auVar46._24_4_ = auVar119._24_4_ * 0.0;
      auVar46._28_4_ = auVar115._28_4_;
      auVar93 = vfmsub231ps_fma(auVar46,auVar114,auVar118);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar122,ZEXT1632(auVar94));
      auVar187._0_4_ = auVar118._0_4_ * auVar127._0_4_;
      auVar187._4_4_ = auVar118._4_4_ * auVar127._4_4_;
      auVar187._8_4_ = auVar118._8_4_ * auVar127._8_4_;
      auVar187._12_4_ = auVar118._12_4_ * auVar127._12_4_;
      auVar187._16_4_ = auVar118._16_4_ * fVar206;
      auVar187._20_4_ = auVar118._20_4_ * fVar208;
      auVar187._24_4_ = auVar118._24_4_ * fVar209;
      auVar187._28_4_ = 0;
      auVar94 = vfmsub231ps_fma(auVar187,auVar107,auVar117);
      auVar120 = vfmadd231ps_avx512vl(auVar115,auVar122,ZEXT1632(auVar94));
      auVar115 = vmulps_avx512vl(auVar113,auVar128);
      auVar115 = vfmsub231ps_avx512vl(auVar115,auVar116,auVar130);
      auVar47._4_4_ = auVar112._4_4_ * auVar130._4_4_;
      auVar47._0_4_ = auVar112._0_4_ * auVar130._0_4_;
      auVar47._8_4_ = auVar112._8_4_ * auVar130._8_4_;
      auVar47._12_4_ = auVar112._12_4_ * auVar130._12_4_;
      auVar47._16_4_ = auVar112._16_4_ * auVar130._16_4_;
      auVar47._20_4_ = auVar112._20_4_ * auVar130._20_4_;
      auVar47._24_4_ = auVar112._24_4_ * auVar130._24_4_;
      auVar47._28_4_ = auVar130._28_4_;
      auVar94 = vfmsub231ps_fma(auVar47,auVar129,auVar113);
      auVar188._0_4_ = auVar129._0_4_ * auVar116._0_4_;
      auVar188._4_4_ = auVar129._4_4_ * auVar116._4_4_;
      auVar188._8_4_ = auVar129._8_4_ * auVar116._8_4_;
      auVar188._12_4_ = auVar129._12_4_ * auVar116._12_4_;
      auVar188._16_4_ = fVar179 * auVar116._16_4_;
      auVar188._20_4_ = fVar171 * auVar116._20_4_;
      auVar188._24_4_ = fVar178 * auVar116._24_4_;
      auVar188._28_4_ = 0;
      auVar93 = vfmsub231ps_fma(auVar188,auVar112,auVar128);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar122,auVar115);
      auVar121 = vfmadd231ps_avx512vl(auVar115,auVar122,ZEXT1632(auVar94));
      auVar193 = ZEXT3264(auVar121);
      auVar115 = vmaxps_avx(auVar120,auVar121);
      uVar169 = vcmpps_avx512vl(auVar115,auVar122,2);
      bVar89 = bVar89 & (byte)uVar169;
      if (bVar89 != 0) {
        auVar48._4_4_ = auVar113._4_4_ * auVar118._4_4_;
        auVar48._0_4_ = auVar113._0_4_ * auVar118._0_4_;
        auVar48._8_4_ = auVar113._8_4_ * auVar118._8_4_;
        auVar48._12_4_ = auVar113._12_4_ * auVar118._12_4_;
        auVar48._16_4_ = auVar113._16_4_ * auVar118._16_4_;
        auVar48._20_4_ = auVar113._20_4_ * auVar118._20_4_;
        auVar48._24_4_ = auVar113._24_4_ * auVar118._24_4_;
        auVar48._28_4_ = auVar115._28_4_;
        auVar8 = vfmsub231ps_fma(auVar48,auVar112,auVar117);
        auVar49._4_4_ = auVar117._4_4_ * auVar116._4_4_;
        auVar49._0_4_ = auVar117._0_4_ * auVar116._0_4_;
        auVar49._8_4_ = auVar117._8_4_ * auVar116._8_4_;
        auVar49._12_4_ = auVar117._12_4_ * auVar116._12_4_;
        auVar49._16_4_ = auVar117._16_4_ * auVar116._16_4_;
        auVar49._20_4_ = auVar117._20_4_ * auVar116._20_4_;
        auVar49._24_4_ = auVar117._24_4_ * auVar116._24_4_;
        auVar49._28_4_ = auVar117._28_4_;
        auVar6 = vfmsub231ps_fma(auVar49,auVar119,auVar113);
        auVar50._4_4_ = auVar112._4_4_ * auVar119._4_4_;
        auVar50._0_4_ = auVar112._0_4_ * auVar119._0_4_;
        auVar50._8_4_ = auVar112._8_4_ * auVar119._8_4_;
        auVar50._12_4_ = auVar112._12_4_ * auVar119._12_4_;
        auVar50._16_4_ = auVar112._16_4_ * auVar119._16_4_;
        auVar50._20_4_ = auVar112._20_4_ * auVar119._20_4_;
        auVar50._24_4_ = auVar112._24_4_ * auVar119._24_4_;
        auVar50._28_4_ = auVar112._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar116,auVar118);
        auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar8),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar93));
        auVar118 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar93),auVar108);
        auVar94 = vfmadd132ps_fma(auVar118,auVar115,auVar115);
        auVar202 = ZEXT1664(auVar94);
        auVar51._4_4_ = auVar9._4_4_ * auVar127._4_4_;
        auVar51._0_4_ = auVar9._0_4_ * auVar127._0_4_;
        auVar51._8_4_ = auVar9._8_4_ * auVar127._8_4_;
        auVar51._12_4_ = auVar9._12_4_ * auVar127._12_4_;
        auVar51._16_4_ = fVar206 * 0.0;
        auVar51._20_4_ = fVar208 * 0.0;
        auVar51._24_4_ = fVar209 * 0.0;
        auVar51._28_4_ = iVar1;
        auVar6 = vfmadd231ps_fma(auVar51,auVar107,ZEXT1632(auVar6));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar114,ZEXT1632(auVar8));
        fVar206 = auVar94._0_4_;
        fVar208 = auVar94._4_4_;
        fVar209 = auVar94._8_4_;
        fVar179 = auVar94._12_4_;
        local_400._28_4_ = auVar115._28_4_;
        local_400._0_28_ =
             ZEXT1628(CONCAT412(auVar6._12_4_ * fVar179,
                                CONCAT48(auVar6._8_4_ * fVar209,
                                         CONCAT44(auVar6._4_4_ * fVar208,auVar6._0_4_ * fVar206))));
        auVar204 = ZEXT3264(local_400);
        auVar161._4_4_ = local_580;
        auVar161._0_4_ = local_580;
        auVar161._8_4_ = local_580;
        auVar161._12_4_ = local_580;
        auVar161._16_4_ = local_580;
        auVar161._20_4_ = local_580;
        auVar161._24_4_ = local_580;
        auVar161._28_4_ = local_580;
        uVar169 = vcmpps_avx512vl(auVar161,local_400,2);
        uVar168 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar168;
        auVar31._0_4_ = uVar168;
        auVar31._8_4_ = uVar168;
        auVar31._12_4_ = uVar168;
        auVar31._16_4_ = uVar168;
        auVar31._20_4_ = uVar168;
        auVar31._24_4_ = uVar168;
        auVar31._28_4_ = uVar168;
        uVar29 = vcmpps_avx512vl(local_400,auVar31,2);
        bVar89 = (byte)uVar169 & (byte)uVar29 & bVar89;
        if (bVar89 != 0) {
          uVar90 = vcmpps_avx512vl(ZEXT1632(auVar93),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar90 = bVar89 & uVar90;
          if ((char)uVar90 != '\0') {
            fVar171 = auVar120._0_4_ * fVar206;
            fVar178 = auVar120._4_4_ * fVar208;
            auVar52._4_4_ = fVar178;
            auVar52._0_4_ = fVar171;
            fVar91 = auVar120._8_4_ * fVar209;
            auVar52._8_4_ = fVar91;
            fVar92 = auVar120._12_4_ * fVar179;
            auVar52._12_4_ = fVar92;
            fVar148 = auVar120._16_4_ * 0.0;
            auVar52._16_4_ = fVar148;
            fVar149 = auVar120._20_4_ * 0.0;
            auVar52._20_4_ = fVar149;
            fVar150 = auVar120._24_4_ * 0.0;
            auVar52._24_4_ = fVar150;
            auVar52._28_4_ = auVar120._28_4_;
            auVar115 = vsubps_avx512vl(auVar108,auVar52);
            local_440._0_4_ =
                 (float)((uint)(bVar80 & 1) * (int)fVar171 |
                        (uint)!(bool)(bVar80 & 1) * auVar115._0_4_);
            bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
            local_440._4_4_ = (float)((uint)bVar20 * (int)fVar178 | (uint)!bVar20 * auVar115._4_4_);
            bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
            local_440._8_4_ = (float)((uint)bVar20 * (int)fVar91 | (uint)!bVar20 * auVar115._8_4_);
            bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
            local_440._12_4_ = (float)((uint)bVar20 * (int)fVar92 | (uint)!bVar20 * auVar115._12_4_)
            ;
            bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
            local_440._16_4_ =
                 (float)((uint)bVar20 * (int)fVar148 | (uint)!bVar20 * auVar115._16_4_);
            bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
            local_440._20_4_ =
                 (float)((uint)bVar20 * (int)fVar149 | (uint)!bVar20 * auVar115._20_4_);
            bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
            local_440._24_4_ =
                 (float)((uint)bVar20 * (int)fVar150 | (uint)!bVar20 * auVar115._24_4_);
            bVar20 = SUB81(uVar81 >> 7,0);
            local_440._28_4_ =
                 (float)((uint)bVar20 * auVar120._28_4_ | (uint)!bVar20 * auVar115._28_4_);
            auVar115 = vsubps_avx(ZEXT1632(auVar218),auVar102);
            auVar94 = vfmadd213ps_fma(auVar115,local_440,auVar102);
            uVar168 = *(undefined4 *)((long)local_628->ray_space + k * 4 + -0x20);
            auVar102._4_4_ = uVar168;
            auVar102._0_4_ = uVar168;
            auVar102._8_4_ = uVar168;
            auVar102._12_4_ = uVar168;
            auVar102._16_4_ = uVar168;
            auVar102._20_4_ = uVar168;
            auVar102._24_4_ = uVar168;
            auVar102._28_4_ = uVar168;
            auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                          CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                   CONCAT44(auVar94._4_4_ +
                                                                            auVar94._4_4_,
                                                                            auVar94._0_4_ +
                                                                            auVar94._0_4_)))),
                                       auVar102);
            uVar28 = vcmpps_avx512vl(local_400,auVar115,6);
            uVar90 = uVar90 & uVar28;
            bVar89 = (byte)uVar90;
            if (bVar89 != 0) {
              auVar177._0_4_ = auVar121._0_4_ * fVar206;
              auVar177._4_4_ = auVar121._4_4_ * fVar208;
              auVar177._8_4_ = auVar121._8_4_ * fVar209;
              auVar177._12_4_ = auVar121._12_4_ * fVar179;
              auVar177._16_4_ = auVar121._16_4_ * 0.0;
              auVar177._20_4_ = auVar121._20_4_ * 0.0;
              auVar177._24_4_ = auVar121._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar115 = vsubps_avx512vl(auVar108,auVar177);
              auVar133._0_4_ =
                   (uint)(bVar80 & 1) * (int)auVar177._0_4_ |
                   (uint)!(bool)(bVar80 & 1) * auVar115._0_4_;
              bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
              auVar133._4_4_ = (uint)bVar20 * (int)auVar177._4_4_ | (uint)!bVar20 * auVar115._4_4_;
              bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
              auVar133._8_4_ = (uint)bVar20 * (int)auVar177._8_4_ | (uint)!bVar20 * auVar115._8_4_;
              bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
              auVar133._12_4_ =
                   (uint)bVar20 * (int)auVar177._12_4_ | (uint)!bVar20 * auVar115._12_4_;
              bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
              auVar133._16_4_ =
                   (uint)bVar20 * (int)auVar177._16_4_ | (uint)!bVar20 * auVar115._16_4_;
              bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
              auVar133._20_4_ =
                   (uint)bVar20 * (int)auVar177._20_4_ | (uint)!bVar20 * auVar115._20_4_;
              bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
              auVar133._24_4_ =
                   (uint)bVar20 * (int)auVar177._24_4_ | (uint)!bVar20 * auVar115._24_4_;
              auVar133._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar115._28_4_;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_420 = vfmsub132ps_avx512vl(auVar133,auVar108,auVar32);
              local_3e0 = 0;
              local_3d0 = local_680;
              uStack_3c8 = uStack_678;
              local_3c0 = local_6a0;
              uStack_3b8 = uStack_698;
              local_3b0 = local_6b0;
              uStack_3a8 = uStack_6a8;
              local_3a0 = local_690;
              uStack_398 = uStack_688;
              if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar172 = 1.0 / auVar110._0_4_;
                local_380[0] = fVar172 * (local_440._0_4_ + 0.0);
                local_380[1] = fVar172 * (local_440._4_4_ + 1.0);
                local_380[2] = fVar172 * (local_440._8_4_ + 2.0);
                local_380[3] = fVar172 * (local_440._12_4_ + 3.0);
                fStack_370 = fVar172 * (local_440._16_4_ + 4.0);
                fStack_36c = fVar172 * (local_440._20_4_ + 5.0);
                fStack_368 = fVar172 * (local_440._24_4_ + 6.0);
                fStack_364 = local_440._28_4_ + 7.0;
                local_360 = local_420;
                local_340 = local_400;
                auVar162._8_4_ = 0x7f800000;
                auVar162._0_8_ = 0x7f8000007f800000;
                auVar162._12_4_ = 0x7f800000;
                auVar162._16_4_ = 0x7f800000;
                auVar162._20_4_ = 0x7f800000;
                auVar162._24_4_ = 0x7f800000;
                auVar162._28_4_ = 0x7f800000;
                auVar115 = vblendmps_avx512vl(auVar162,local_400);
                auVar134._0_4_ =
                     (uint)(bVar89 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 1) & 1);
                auVar134._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 2) & 1);
                auVar134._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 3) & 1);
                auVar134._12_4_ = (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 4) & 1);
                auVar134._16_4_ = (uint)bVar20 * auVar115._16_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 5) & 1);
                auVar134._20_4_ = (uint)bVar20 * auVar115._20_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = (bool)((byte)(uVar90 >> 6) & 1);
                auVar134._24_4_ = (uint)bVar20 * auVar115._24_4_ | (uint)!bVar20 * 0x7f800000;
                bVar20 = SUB81(uVar90 >> 7,0);
                auVar134._28_4_ = (uint)bVar20 * auVar115._28_4_ | (uint)!bVar20 * 0x7f800000;
                auVar115 = vshufps_avx(auVar134,auVar134,0xb1);
                auVar115 = vminps_avx(auVar134,auVar115);
                auVar118 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar118);
                auVar118 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar118);
                uVar169 = vcmpps_avx512vl(auVar134,auVar115,0);
                uVar82 = (uint)uVar90;
                if ((bVar89 & (byte)uVar169) != 0) {
                  uVar82 = (uint)(bVar89 & (byte)uVar169);
                }
                uVar30 = 0;
                for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                  uVar30 = uVar30 + 1;
                }
                uVar81 = (ulong)uVar30;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_5a0 = *(float *)(ray + k * 4 + 0x100);
                  fStack_59c = 0.0;
                  fStack_598 = 0.0;
                  fStack_594 = 0.0;
                  local_5e0 = local_400;
                  local_3dc = iVar14;
                  do {
                    local_1e0 = local_380[uVar81];
                    local_1c0 = *(undefined4 *)(local_360 + uVar81 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar81 * 4);
                    local_670.context = context->user;
                    fVar206 = 1.0 - local_1e0;
                    fVar172 = fVar206 * fVar206 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                              ZEXT416((uint)(local_1e0 * fVar206)),
                                              ZEXT416(0xc0000000));
                    auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar206)),
                                              ZEXT416((uint)(local_1e0 * local_1e0)),
                                              ZEXT416(0x40000000));
                    fVar206 = auVar94._0_4_ * 3.0;
                    fVar208 = auVar93._0_4_ * 3.0;
                    fVar209 = local_1e0 * local_1e0 * 3.0;
                    auVar198._0_4_ = fVar209 * fVar27;
                    auVar198._4_4_ = fVar209 * fVar70;
                    auVar198._8_4_ = fVar209 * fVar71;
                    auVar198._12_4_ = fVar209 * fVar79;
                    auVar159._4_4_ = fVar208;
                    auVar159._0_4_ = fVar208;
                    auVar159._8_4_ = fVar208;
                    auVar159._12_4_ = fVar208;
                    auVar94 = vfmadd132ps_fma(auVar159,auVar198,auVar96);
                    auVar185._4_4_ = fVar206;
                    auVar185._0_4_ = fVar206;
                    auVar185._8_4_ = fVar206;
                    auVar185._12_4_ = fVar206;
                    auVar94 = vfmadd132ps_fma(auVar185,auVar94,auVar156);
                    auVar160._4_4_ = fVar172;
                    auVar160._0_4_ = fVar172;
                    auVar160._8_4_ = fVar172;
                    auVar160._12_4_ = fVar172;
                    auVar94 = vfmadd132ps_fma(auVar160,auVar94,auVar7);
                    local_240 = auVar94._0_4_;
                    auVar192._8_4_ = 1;
                    auVar192._0_8_ = 0x100000001;
                    auVar192._12_4_ = 1;
                    auVar192._16_4_ = 1;
                    auVar192._20_4_ = 1;
                    auVar192._24_4_ = 1;
                    auVar192._28_4_ = 1;
                    local_220 = vpermps_avx2(auVar192,ZEXT1632(auVar94));
                    auVar193 = ZEXT3264(local_220);
                    auVar199._8_4_ = 2;
                    auVar199._0_8_ = 0x200000002;
                    auVar199._12_4_ = 2;
                    auVar201._16_4_ = 2;
                    auVar201._0_16_ = auVar199;
                    auVar201._20_4_ = 2;
                    auVar201._24_4_ = 2;
                    auVar201._28_4_ = 2;
                    auVar202 = ZEXT3264(auVar201);
                    local_200 = vpermps_avx2(auVar201,ZEXT1632(auVar94));
                    iStack_23c = local_240;
                    iStack_238 = local_240;
                    iStack_234 = local_240;
                    iStack_230 = local_240;
                    iStack_22c = local_240;
                    iStack_228 = local_240;
                    iStack_224 = local_240;
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_300._0_8_;
                    uStack_198 = local_300._8_8_;
                    uStack_190 = local_300._16_8_;
                    uStack_188 = local_300._24_8_;
                    local_180 = local_2e0;
                    auVar115 = vpcmpeqd_avx2(local_2e0,local_2e0);
                    local_630[1] = auVar115;
                    *local_630 = auVar115;
                    local_160 = (local_670.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_670.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_620 = local_320;
                    local_670.valid = (int *)local_620;
                    local_670.geometryUserPtr = pGVar86->userPtr;
                    local_670.hit = (RTCHitN *)&local_240;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar193 = ZEXT1664(local_220._0_16_);
                      auVar202 = ZEXT1664(auVar199);
                      (*pGVar86->intersectionFilterN)(&local_670);
                      auVar204 = ZEXT3264(local_5e0);
                      auVar222 = ZEXT3264(local_560);
                      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar221 = ZEXT3264(auVar115);
                    }
                    if (local_620 == (undefined1  [32])0x0) {
LAB_01b7951c:
                      *(float *)(ray + k * 4 + 0x100) = local_5a0;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar193 = ZEXT1664(auVar193._0_16_);
                        auVar202 = ZEXT1664(auVar202._0_16_);
                        (*p_Var19)(&local_670);
                        auVar204 = ZEXT3264(local_5e0);
                        auVar222 = ZEXT3264(local_560);
                        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar221 = ZEXT3264(auVar115);
                      }
                      if (local_620 == (undefined1  [32])0x0) goto LAB_01b7951c;
                      uVar28 = vptestmd_avx512vl(local_620,local_620);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar72 = *(int *)(local_670.hit + 0xc);
                      iVar73 = *(int *)(local_670.hit + 0x10);
                      iVar74 = *(int *)(local_670.hit + 0x14);
                      iVar75 = *(int *)(local_670.hit + 0x18);
                      iVar76 = *(int *)(local_670.hit + 0x1c);
                      bVar89 = (byte)uVar28;
                      bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar26 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar89 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar72 = *(int *)(local_670.hit + 0x2c);
                      iVar73 = *(int *)(local_670.hit + 0x30);
                      iVar74 = *(int *)(local_670.hit + 0x34);
                      iVar75 = *(int *)(local_670.hit + 0x38);
                      iVar76 = *(int *)(local_670.hit + 0x3c);
                      bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar26 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar72 = *(int *)(local_670.hit + 0x4c);
                      iVar73 = *(int *)(local_670.hit + 0x50);
                      iVar74 = *(int *)(local_670.hit + 0x54);
                      iVar75 = *(int *)(local_670.hit + 0x58);
                      iVar76 = *(int *)(local_670.hit + 0x5c);
                      bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar26 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar72 = *(int *)(local_670.hit + 0x6c);
                      iVar73 = *(int *)(local_670.hit + 0x70);
                      iVar74 = *(int *)(local_670.hit + 0x74);
                      iVar75 = *(int *)(local_670.hit + 0x78);
                      iVar76 = *(int *)(local_670.hit + 0x7c);
                      bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar26 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar72 = *(int *)(local_670.hit + 0x8c);
                      iVar73 = *(int *)(local_670.hit + 0x90);
                      iVar74 = *(int *)(local_670.hit + 0x94);
                      iVar75 = *(int *)(local_670.hit + 0x98);
                      iVar76 = *(int *)(local_670.hit + 0x9c);
                      bVar20 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar25 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar26 = SUB81(uVar28 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar20 * iVar1 | (uint)!bVar20 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar21 * iVar2 | (uint)!bVar21 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar26 * iVar76 | (uint)!bVar26 * *(int *)(local_670.ray + 0x21c);
                      auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar115;
                      auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar115;
                      auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar115;
                      auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar115;
                      local_5a0 = *(float *)(ray + k * 4 + 0x100);
                      fStack_59c = 0.0;
                      fStack_598 = 0.0;
                      fStack_594 = 0.0;
                    }
                    bVar89 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar90;
                    auVar166._4_4_ = local_5a0;
                    auVar166._0_4_ = local_5a0;
                    auVar166._8_4_ = local_5a0;
                    auVar166._12_4_ = local_5a0;
                    auVar166._16_4_ = local_5a0;
                    auVar166._20_4_ = local_5a0;
                    auVar166._24_4_ = local_5a0;
                    auVar166._28_4_ = local_5a0;
                    uVar169 = vcmpps_avx512vl(auVar204._0_32_,auVar166,2);
                    if ((bVar89 & (byte)uVar169) == 0) goto LAB_01b784ef;
                    bVar89 = bVar89 & (byte)uVar169;
                    uVar90 = (ulong)bVar89;
                    auVar167._8_4_ = 0x7f800000;
                    auVar167._0_8_ = 0x7f8000007f800000;
                    auVar167._12_4_ = 0x7f800000;
                    auVar167._16_4_ = 0x7f800000;
                    auVar167._20_4_ = 0x7f800000;
                    auVar167._24_4_ = 0x7f800000;
                    auVar167._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar167,auVar204._0_32_);
                    auVar147._0_4_ =
                         (uint)(bVar89 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 1 & 1);
                    auVar147._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 2 & 1);
                    auVar147._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 3 & 1);
                    auVar147._12_4_ = (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 4 & 1);
                    auVar147._16_4_ = (uint)bVar20 * auVar115._16_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 5 & 1);
                    auVar147._20_4_ = (uint)bVar20 * auVar115._20_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)(bVar89 >> 6 & 1);
                    auVar147._24_4_ = (uint)bVar20 * auVar115._24_4_ | (uint)!bVar20 * 0x7f800000;
                    auVar147._28_4_ =
                         (uint)(bVar89 >> 7) * auVar115._28_4_ |
                         (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
                    auVar115 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar115 = vminps_avx(auVar147,auVar115);
                    auVar118 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar118);
                    auVar118 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar118);
                    uVar169 = vcmpps_avx512vl(auVar147,auVar115,0);
                    bVar80 = (byte)uVar169 & bVar89;
                    if (bVar80 != 0) {
                      bVar89 = bVar80;
                    }
                    uVar83 = 0;
                    for (uVar82 = (uint)bVar89; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar81 = (ulong)uVar83;
                  } while( true );
                }
                fVar172 = local_380[uVar81];
                uVar168 = *(undefined4 *)(local_360 + uVar81 * 4);
                fVar208 = 1.0 - fVar172;
                fVar206 = fVar208 * fVar208 * -3.0;
                auVar193 = ZEXT464((uint)fVar206);
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                          ZEXT416((uint)(fVar172 * fVar208)),ZEXT416(0xc0000000));
                auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar172 * fVar208)),
                                          ZEXT416((uint)(fVar172 * fVar172)),ZEXT416(0x40000000));
                fVar208 = auVar94._0_4_ * 3.0;
                fVar209 = auVar93._0_4_ * 3.0;
                fVar179 = fVar172 * fVar172 * 3.0;
                auVar194._0_4_ = fVar179 * fVar27;
                auVar194._4_4_ = fVar179 * fVar70;
                auVar194._8_4_ = fVar179 * fVar71;
                auVar194._12_4_ = fVar179 * fVar79;
                auVar202 = ZEXT1664(auVar194);
                auVar173._4_4_ = fVar209;
                auVar173._0_4_ = fVar209;
                auVar173._8_4_ = fVar209;
                auVar173._12_4_ = fVar209;
                auVar94 = vfmadd132ps_fma(auVar173,auVar194,auVar96);
                auVar182._4_4_ = fVar208;
                auVar182._0_4_ = fVar208;
                auVar182._8_4_ = fVar208;
                auVar182._12_4_ = fVar208;
                auVar94 = vfmadd132ps_fma(auVar182,auVar94,auVar156);
                auVar174._4_4_ = fVar206;
                auVar174._0_4_ = fVar206;
                auVar174._8_4_ = fVar206;
                auVar174._12_4_ = fVar206;
                auVar94 = vfmadd132ps_fma(auVar174,auVar94,auVar7);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar81 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar94._0_4_;
                uVar15 = vextractps_avx(auVar94,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                uVar15 = vextractps_avx(auVar94,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                *(float *)(ray + k * 4 + 0x1e0) = fVar172;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar168;
                *(uint *)(ray + k * 4 + 0x220) = uVar83;
                *(uint *)(ray + k * 4 + 0x240) = uVar13;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01b784ef:
                fVar172 = (float)local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = fVar172;
    if (8 < iVar14) {
      auVar115 = vpbroadcastd_avx512vl();
      auVar223 = ZEXT3264(auVar115);
      local_5a0 = (float)local_640._0_4_;
      fStack_59c = (float)local_640._0_4_;
      fStack_598 = (float)local_640._0_4_;
      fStack_594 = (float)local_640._0_4_;
      fStack_590 = (float)local_640._0_4_;
      fStack_58c = (float)local_640._0_4_;
      fStack_588 = (float)local_640._0_4_;
      fStack_584 = (float)local_640._0_4_;
      uStack_57c = local_580;
      uStack_578 = local_580;
      uStack_574 = local_580;
      uStack_570 = local_580;
      uStack_56c = local_580;
      uStack_568 = local_580;
      uStack_564 = local_580;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar84 = 8;
LAB_01b78574:
      if (lVar84 < iVar14) {
        auVar115 = vpbroadcastd_avx512vl();
        auVar115 = vpor_avx2(auVar115,_DAT_01fb4ba0);
        uVar29 = vpcmpgtd_avx512vl(auVar223._0_32_,auVar115);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 * 4 + lVar87);
        auVar118 = *(undefined1 (*) [32])(lVar87 + 0x21fb768 + lVar84 * 4);
        auVar117 = *(undefined1 (*) [32])(lVar87 + 0x21fbbec + lVar84 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar87 + 0x21fc070 + lVar84 * 4);
        auVar203._0_4_ = auVar116._0_4_ * (float)local_520._0_4_;
        auVar203._4_4_ = auVar116._4_4_ * (float)local_520._4_4_;
        auVar203._8_4_ = auVar116._8_4_ * fStack_518;
        auVar203._12_4_ = auVar116._12_4_ * fStack_514;
        auVar203._16_4_ = auVar116._16_4_ * fStack_510;
        auVar203._20_4_ = auVar116._20_4_ * fStack_50c;
        auVar203._28_36_ = auVar202._28_36_;
        auVar203._24_4_ = auVar116._24_4_ * fStack_508;
        auVar202._0_4_ = auVar116._0_4_ * (float)local_540._0_4_;
        auVar202._4_4_ = auVar116._4_4_ * (float)local_540._4_4_;
        auVar202._8_4_ = auVar116._8_4_ * fStack_538;
        auVar202._12_4_ = auVar116._12_4_ * fStack_534;
        auVar202._16_4_ = auVar116._16_4_ * fStack_530;
        auVar202._20_4_ = auVar116._20_4_ * fStack_52c;
        auVar202._28_36_ = auVar193._28_36_;
        auVar202._24_4_ = auVar116._24_4_ * fStack_528;
        auVar112 = vmulps_avx512vl(local_e0,auVar116);
        auVar113 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar117,local_4e0);
        auVar114 = vfmadd231ps_avx512vl(auVar202._0_32_,auVar117,local_500);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_4a0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,local_4c0);
        auVar107 = vfmadd231ps_avx512vl(auVar112,auVar118,local_a0);
        auVar94 = vfmadd231ps_fma(auVar113,auVar115,local_460);
        auVar202 = ZEXT1664(auVar94);
        auVar93 = vfmadd231ps_fma(auVar114,auVar115,local_480);
        auVar193 = ZEXT1664(auVar93);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 * 4 + lVar87);
        auVar113 = *(undefined1 (*) [32])(lVar87 + 0x21fdb88 + lVar84 * 4);
        auVar120 = vfmadd231ps_avx512vl(auVar107,auVar115,local_80);
        auVar114 = *(undefined1 (*) [32])(lVar87 + 0x21fe00c + lVar84 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar87 + 0x21fe490 + lVar84 * 4);
        auVar205._0_4_ = auVar107._0_4_ * (float)local_520._0_4_;
        auVar205._4_4_ = auVar107._4_4_ * (float)local_520._4_4_;
        auVar205._8_4_ = auVar107._8_4_ * fStack_518;
        auVar205._12_4_ = auVar107._12_4_ * fStack_514;
        auVar205._16_4_ = auVar107._16_4_ * fStack_510;
        auVar205._20_4_ = auVar107._20_4_ * fStack_50c;
        auVar205._28_36_ = auVar204._28_36_;
        auVar205._24_4_ = auVar107._24_4_ * fStack_508;
        auVar53._4_4_ = auVar107._4_4_ * (float)local_540._4_4_;
        auVar53._0_4_ = auVar107._0_4_ * (float)local_540._0_4_;
        auVar53._8_4_ = auVar107._8_4_ * fStack_538;
        auVar53._12_4_ = auVar107._12_4_ * fStack_534;
        auVar53._16_4_ = auVar107._16_4_ * fStack_530;
        auVar53._20_4_ = auVar107._20_4_ * fStack_52c;
        auVar53._24_4_ = auVar107._24_4_ * fStack_528;
        auVar53._28_4_ = uStack_524;
        auVar108 = vmulps_avx512vl(local_e0,auVar107);
        auVar119 = vfmadd231ps_avx512vl(auVar205._0_32_,auVar114,local_4e0);
        auVar121 = vfmadd231ps_avx512vl(auVar53,auVar114,local_500);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_c0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar113,local_4a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,local_4c0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_a0);
        auVar6 = vfmadd231ps_fma(auVar119,auVar112,local_460);
        auVar204 = ZEXT1664(auVar6);
        auVar8 = vfmadd231ps_fma(auVar121,auVar112,local_480);
        auVar121 = vfmadd231ps_avx512vl(auVar108,auVar112,local_80);
        auVar122 = vmaxps_avx512vl(auVar120,auVar121);
        auVar108 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar94));
        auVar119 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar93));
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar93),auVar108);
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar94),auVar119);
        auVar101 = vsubps_avx512vl(auVar101,auVar102);
        auVar102 = vmulps_avx512vl(auVar119,auVar119);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar108);
        auVar122 = vmulps_avx512vl(auVar122,auVar122);
        auVar122 = vmulps_avx512vl(auVar122,auVar102);
        auVar101 = vmulps_avx512vl(auVar101,auVar101);
        uVar169 = vcmpps_avx512vl(auVar101,auVar122,2);
        bVar89 = (byte)uVar29 & (byte)uVar169;
        if (bVar89 != 0) {
          auVar107 = vmulps_avx512vl(local_2c0,auVar107);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_2a0,auVar107);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_280,auVar114);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_260,auVar113);
          auVar116 = vmulps_avx512vl(local_2c0,auVar116);
          auVar117 = vfmadd213ps_avx512vl(auVar117,local_2a0,auVar116);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_280,auVar117);
          auVar113 = vfmadd213ps_avx512vl(auVar115,local_260,auVar118);
          auVar115 = *(undefined1 (*) [32])(lVar87 + 0x21fc4f4 + lVar84 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar87 + 0x21fc978 + lVar84 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar87 + 0x21fcdfc + lVar84 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar87 + 0x21fd280 + lVar84 * 4);
          auVar114 = vmulps_avx512vl(_local_520,auVar116);
          auVar107 = vmulps_avx512vl(_local_540,auVar116);
          auVar116 = vmulps_avx512vl(local_2c0,auVar116);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_4e0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_500);
          auVar117 = vfmadd231ps_avx512vl(auVar116,local_2a0,auVar117);
          auVar116 = vfmadd231ps_avx512vl(auVar114,auVar118,local_4a0);
          auVar114 = vfmadd231ps_avx512vl(auVar107,auVar118,local_4c0);
          auVar118 = vfmadd231ps_avx512vl(auVar117,local_280,auVar118);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,local_460);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar115,local_480);
          auVar107 = vfmadd231ps_avx512vl(auVar118,local_260,auVar115);
          auVar115 = *(undefined1 (*) [32])(lVar87 + 0x21fe914 + lVar84 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar87 + 0x21ff21c + lVar84 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar87 + 0x21ff6a0 + lVar84 * 4);
          auVar122 = vmulps_avx512vl(_local_520,auVar117);
          auVar101 = vmulps_avx512vl(_local_540,auVar117);
          auVar117 = vmulps_avx512vl(local_2c0,auVar117);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,local_4e0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar118,local_500);
          auVar117 = vfmadd231ps_avx512vl(auVar117,local_2a0,auVar118);
          auVar118 = *(undefined1 (*) [32])(lVar87 + 0x21fed98 + lVar84 * 4);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,local_4a0);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar118,local_4c0);
          auVar118 = vfmadd231ps_avx512vl(auVar117,local_280,auVar118);
          auVar117 = vfmadd231ps_avx512vl(auVar122,auVar115,local_460);
          auVar122 = vfmadd231ps_avx512vl(auVar101,auVar115,local_480);
          auVar118 = vfmadd231ps_avx512vl(auVar118,local_260,auVar115);
          auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar116,auVar101);
          vandps_avx512vl(auVar114,auVar101);
          auVar115 = vmaxps_avx(auVar101,auVar101);
          vandps_avx512vl(auVar107,auVar101);
          auVar115 = vmaxps_avx(auVar115,auVar101);
          auVar77._4_4_ = fStack_59c;
          auVar77._0_4_ = local_5a0;
          auVar77._8_4_ = fStack_598;
          auVar77._12_4_ = fStack_594;
          auVar77._16_4_ = fStack_590;
          auVar77._20_4_ = fStack_58c;
          auVar77._24_4_ = fStack_588;
          auVar77._28_4_ = fStack_584;
          uVar81 = vcmpps_avx512vl(auVar115,auVar77,1);
          bVar20 = (bool)((byte)uVar81 & 1);
          auVar135._0_4_ = (float)((uint)bVar20 * auVar108._0_4_ | (uint)!bVar20 * auVar116._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar20 * auVar108._4_4_ | (uint)!bVar20 * auVar116._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar20 * auVar108._8_4_ | (uint)!bVar20 * auVar116._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar20 * auVar108._12_4_ | (uint)!bVar20 * auVar116._12_4_);
          bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar135._16_4_ =
               (float)((uint)bVar20 * auVar108._16_4_ | (uint)!bVar20 * auVar116._16_4_);
          bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar135._20_4_ =
               (float)((uint)bVar20 * auVar108._20_4_ | (uint)!bVar20 * auVar116._20_4_);
          bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar135._24_4_ =
               (float)((uint)bVar20 * auVar108._24_4_ | (uint)!bVar20 * auVar116._24_4_);
          bVar20 = SUB81(uVar81 >> 7,0);
          auVar135._28_4_ = (uint)bVar20 * auVar108._28_4_ | (uint)!bVar20 * auVar116._28_4_;
          bVar20 = (bool)((byte)uVar81 & 1);
          auVar136._0_4_ = (float)((uint)bVar20 * auVar119._0_4_ | (uint)!bVar20 * auVar114._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar20 * auVar119._4_4_ | (uint)!bVar20 * auVar114._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar20 * auVar119._8_4_ | (uint)!bVar20 * auVar114._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar20 * auVar119._12_4_ | (uint)!bVar20 * auVar114._12_4_);
          bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar20 * auVar119._16_4_ | (uint)!bVar20 * auVar114._16_4_);
          bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar20 * auVar119._20_4_ | (uint)!bVar20 * auVar114._20_4_);
          bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar20 * auVar119._24_4_ | (uint)!bVar20 * auVar114._24_4_);
          bVar20 = SUB81(uVar81 >> 7,0);
          auVar136._28_4_ = (uint)bVar20 * auVar119._28_4_ | (uint)!bVar20 * auVar114._28_4_;
          vandps_avx512vl(auVar117,auVar101);
          vandps_avx512vl(auVar122,auVar101);
          auVar115 = vmaxps_avx(auVar136,auVar136);
          vandps_avx512vl(auVar118,auVar101);
          auVar115 = vmaxps_avx(auVar115,auVar136);
          uVar81 = vcmpps_avx512vl(auVar115,auVar77,1);
          bVar20 = (bool)((byte)uVar81 & 1);
          auVar137._0_4_ = (uint)bVar20 * auVar108._0_4_ | (uint)!bVar20 * auVar117._0_4_;
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar20 * auVar108._4_4_ | (uint)!bVar20 * auVar117._4_4_;
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar20 * auVar108._8_4_ | (uint)!bVar20 * auVar117._8_4_;
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar20 * auVar108._12_4_ | (uint)!bVar20 * auVar117._12_4_;
          bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar20 * auVar108._16_4_ | (uint)!bVar20 * auVar117._16_4_;
          bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar20 * auVar108._20_4_ | (uint)!bVar20 * auVar117._20_4_;
          bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar20 * auVar108._24_4_ | (uint)!bVar20 * auVar117._24_4_;
          bVar20 = SUB81(uVar81 >> 7,0);
          auVar137._28_4_ = (uint)bVar20 * auVar108._28_4_ | (uint)!bVar20 * auVar117._28_4_;
          bVar20 = (bool)((byte)uVar81 & 1);
          auVar138._0_4_ = (float)((uint)bVar20 * auVar119._0_4_ | (uint)!bVar20 * auVar122._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar20 * auVar119._4_4_ | (uint)!bVar20 * auVar122._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar20 * auVar119._8_4_ | (uint)!bVar20 * auVar122._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar138._12_4_ =
               (float)((uint)bVar20 * auVar119._12_4_ | (uint)!bVar20 * auVar122._12_4_);
          bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar138._16_4_ =
               (float)((uint)bVar20 * auVar119._16_4_ | (uint)!bVar20 * auVar122._16_4_);
          bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar138._20_4_ =
               (float)((uint)bVar20 * auVar119._20_4_ | (uint)!bVar20 * auVar122._20_4_);
          bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar138._24_4_ =
               (float)((uint)bVar20 * auVar119._24_4_ | (uint)!bVar20 * auVar122._24_4_);
          bVar20 = SUB81(uVar81 >> 7,0);
          auVar138._28_4_ = (uint)bVar20 * auVar119._28_4_ | (uint)!bVar20 * auVar122._28_4_;
          auVar211._8_4_ = 0x80000000;
          auVar211._0_8_ = 0x8000000080000000;
          auVar211._12_4_ = 0x80000000;
          auVar211._16_4_ = 0x80000000;
          auVar211._20_4_ = 0x80000000;
          auVar211._24_4_ = 0x80000000;
          auVar211._28_4_ = 0x80000000;
          auVar115 = vxorps_avx512vl(auVar137,auVar211);
          auVar100 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
          auVar118 = vfmadd213ps_avx512vl(auVar135,auVar135,ZEXT1632(auVar100));
          auVar9 = vfmadd231ps_fma(auVar118,auVar136,auVar136);
          auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar9));
          auVar220._8_4_ = 0xbf000000;
          auVar220._0_8_ = 0xbf000000bf000000;
          auVar220._12_4_ = 0xbf000000;
          auVar220._16_4_ = 0xbf000000;
          auVar220._20_4_ = 0xbf000000;
          auVar220._24_4_ = 0xbf000000;
          auVar220._28_4_ = 0xbf000000;
          fVar172 = auVar118._0_4_;
          fVar206 = auVar118._4_4_;
          fVar208 = auVar118._8_4_;
          fVar209 = auVar118._12_4_;
          fVar179 = auVar118._16_4_;
          fVar171 = auVar118._20_4_;
          fVar178 = auVar118._24_4_;
          auVar54._4_4_ = fVar206 * fVar206 * fVar206 * auVar9._4_4_ * -0.5;
          auVar54._0_4_ = fVar172 * fVar172 * fVar172 * auVar9._0_4_ * -0.5;
          auVar54._8_4_ = fVar208 * fVar208 * fVar208 * auVar9._8_4_ * -0.5;
          auVar54._12_4_ = fVar209 * fVar209 * fVar209 * auVar9._12_4_ * -0.5;
          auVar54._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar54._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar54._24_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar54._28_4_ = auVar136._28_4_;
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar118 = vfmadd231ps_avx512vl(auVar54,auVar117,auVar118);
          auVar55._4_4_ = auVar136._4_4_ * auVar118._4_4_;
          auVar55._0_4_ = auVar136._0_4_ * auVar118._0_4_;
          auVar55._8_4_ = auVar136._8_4_ * auVar118._8_4_;
          auVar55._12_4_ = auVar136._12_4_ * auVar118._12_4_;
          auVar55._16_4_ = auVar136._16_4_ * auVar118._16_4_;
          auVar55._20_4_ = auVar136._20_4_ * auVar118._20_4_;
          auVar55._24_4_ = auVar136._24_4_ * auVar118._24_4_;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = auVar118._4_4_ * -auVar135._4_4_;
          auVar56._0_4_ = auVar118._0_4_ * -auVar135._0_4_;
          auVar56._8_4_ = auVar118._8_4_ * -auVar135._8_4_;
          auVar56._12_4_ = auVar118._12_4_ * -auVar135._12_4_;
          auVar56._16_4_ = auVar118._16_4_ * -auVar135._16_4_;
          auVar56._20_4_ = auVar118._20_4_ * -auVar135._20_4_;
          auVar56._24_4_ = auVar118._24_4_ * -auVar135._24_4_;
          auVar56._28_4_ = auVar136._28_4_;
          auVar116 = vmulps_avx512vl(auVar118,ZEXT1632(auVar100));
          auVar107 = ZEXT1632(auVar100);
          auVar118 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar107);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar138,auVar138);
          auVar114 = vrsqrt14ps_avx512vl(auVar118);
          auVar118 = vmulps_avx512vl(auVar118,auVar220);
          fVar172 = auVar114._0_4_;
          fVar206 = auVar114._4_4_;
          fVar208 = auVar114._8_4_;
          fVar209 = auVar114._12_4_;
          fVar179 = auVar114._16_4_;
          fVar171 = auVar114._20_4_;
          fVar178 = auVar114._24_4_;
          auVar57._4_4_ = fVar206 * fVar206 * fVar206 * auVar118._4_4_;
          auVar57._0_4_ = fVar172 * fVar172 * fVar172 * auVar118._0_4_;
          auVar57._8_4_ = fVar208 * fVar208 * fVar208 * auVar118._8_4_;
          auVar57._12_4_ = fVar209 * fVar209 * fVar209 * auVar118._12_4_;
          auVar57._16_4_ = fVar179 * fVar179 * fVar179 * auVar118._16_4_;
          auVar57._20_4_ = fVar171 * fVar171 * fVar171 * auVar118._20_4_;
          auVar57._24_4_ = fVar178 * fVar178 * fVar178 * auVar118._24_4_;
          auVar57._28_4_ = auVar118._28_4_;
          auVar118 = vfmadd231ps_avx512vl(auVar57,auVar117,auVar114);
          auVar58._4_4_ = auVar138._4_4_ * auVar118._4_4_;
          auVar58._0_4_ = auVar138._0_4_ * auVar118._0_4_;
          auVar58._8_4_ = auVar138._8_4_ * auVar118._8_4_;
          auVar58._12_4_ = auVar138._12_4_ * auVar118._12_4_;
          auVar58._16_4_ = auVar138._16_4_ * auVar118._16_4_;
          auVar58._20_4_ = auVar138._20_4_ * auVar118._20_4_;
          auVar58._24_4_ = auVar138._24_4_ * auVar118._24_4_;
          auVar58._28_4_ = auVar114._28_4_;
          auVar59._4_4_ = auVar118._4_4_ * auVar115._4_4_;
          auVar59._0_4_ = auVar118._0_4_ * auVar115._0_4_;
          auVar59._8_4_ = auVar118._8_4_ * auVar115._8_4_;
          auVar59._12_4_ = auVar118._12_4_ * auVar115._12_4_;
          auVar59._16_4_ = auVar118._16_4_ * auVar115._16_4_;
          auVar59._20_4_ = auVar118._20_4_ * auVar115._20_4_;
          auVar59._24_4_ = auVar118._24_4_ * auVar115._24_4_;
          auVar59._28_4_ = auVar115._28_4_;
          auVar115 = vmulps_avx512vl(auVar118,auVar107);
          auVar9 = vfmadd213ps_fma(auVar55,auVar120,ZEXT1632(auVar94));
          auVar10 = vfmadd213ps_fma(auVar56,auVar120,ZEXT1632(auVar93));
          auVar117 = vfmadd213ps_avx512vl(auVar116,auVar120,auVar113);
          auVar114 = vfmadd213ps_avx512vl(auVar58,auVar121,ZEXT1632(auVar6));
          auVar12 = vfnmadd213ps_fma(auVar55,auVar120,ZEXT1632(auVar94));
          auVar94 = vfmadd213ps_fma(auVar59,auVar121,ZEXT1632(auVar8));
          auVar218 = vfnmadd213ps_fma(auVar56,auVar120,ZEXT1632(auVar93));
          auVar93 = vfmadd213ps_fma(auVar115,auVar121,auVar112);
          auVar98 = vfnmadd231ps_fma(auVar113,auVar120,auVar116);
          auVar95 = vfnmadd213ps_fma(auVar58,auVar121,ZEXT1632(auVar6));
          auVar97 = vfnmadd213ps_fma(auVar59,auVar121,ZEXT1632(auVar8));
          auVar99 = vfnmadd231ps_fma(auVar112,auVar121,auVar115);
          auVar112 = vsubps_avx512vl(auVar114,ZEXT1632(auVar12));
          auVar115 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar218));
          auVar118 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar98));
          auVar60._4_4_ = auVar115._4_4_ * auVar98._4_4_;
          auVar60._0_4_ = auVar115._0_4_ * auVar98._0_4_;
          auVar60._8_4_ = auVar115._8_4_ * auVar98._8_4_;
          auVar60._12_4_ = auVar115._12_4_ * auVar98._12_4_;
          auVar60._16_4_ = auVar115._16_4_ * 0.0;
          auVar60._20_4_ = auVar115._20_4_ * 0.0;
          auVar60._24_4_ = auVar115._24_4_ * 0.0;
          auVar60._28_4_ = auVar116._28_4_;
          auVar6 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar218),auVar118);
          auVar61._4_4_ = auVar118._4_4_ * auVar12._4_4_;
          auVar61._0_4_ = auVar118._0_4_ * auVar12._0_4_;
          auVar61._8_4_ = auVar118._8_4_ * auVar12._8_4_;
          auVar61._12_4_ = auVar118._12_4_ * auVar12._12_4_;
          auVar61._16_4_ = auVar118._16_4_ * 0.0;
          auVar61._20_4_ = auVar118._20_4_ * 0.0;
          auVar61._24_4_ = auVar118._24_4_ * 0.0;
          auVar61._28_4_ = auVar118._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar98),auVar112);
          auVar62._4_4_ = auVar218._4_4_ * auVar112._4_4_;
          auVar62._0_4_ = auVar218._0_4_ * auVar112._0_4_;
          auVar62._8_4_ = auVar218._8_4_ * auVar112._8_4_;
          auVar62._12_4_ = auVar218._12_4_ * auVar112._12_4_;
          auVar62._16_4_ = auVar112._16_4_ * 0.0;
          auVar62._20_4_ = auVar112._20_4_ * 0.0;
          auVar62._24_4_ = auVar112._24_4_ * 0.0;
          auVar62._28_4_ = auVar112._28_4_;
          auVar11 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar12),auVar115);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar107,ZEXT1632(auVar8));
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,ZEXT1632(auVar6));
          auVar101 = ZEXT1632(auVar100);
          uVar81 = vcmpps_avx512vl(auVar115,auVar101,2);
          bVar80 = (byte)uVar81;
          fVar148 = (float)((uint)(bVar80 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar95._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar150 = (float)((uint)bVar20 * auVar9._4_4_ | (uint)!bVar20 * auVar95._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar152 = (float)((uint)bVar20 * auVar9._8_4_ | (uint)!bVar20 * auVar95._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar154 = (float)((uint)bVar20 * auVar9._12_4_ | (uint)!bVar20 * auVar95._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar148))));
          fVar149 = (float)((uint)(bVar80 & 1) * auVar10._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar97._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar151 = (float)((uint)bVar20 * auVar10._4_4_ | (uint)!bVar20 * auVar97._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar153 = (float)((uint)bVar20 * auVar10._8_4_ | (uint)!bVar20 * auVar97._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar155 = (float)((uint)bVar20 * auVar10._12_4_ | (uint)!bVar20 * auVar97._12_4_);
          auVar108 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar153,CONCAT44(fVar151,fVar149))));
          auVar139._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar99._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar20 * auVar117._4_4_ | (uint)!bVar20 * auVar99._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar20 * auVar117._8_4_ | (uint)!bVar20 * auVar99._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar139._12_4_ = (float)((uint)bVar20 * auVar117._12_4_ | (uint)!bVar20 * auVar99._12_4_)
          ;
          fVar206 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
          auVar139._16_4_ = fVar206;
          fVar208 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
          auVar139._20_4_ = fVar208;
          fVar172 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
          auVar139._24_4_ = fVar172;
          iVar1 = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
          auVar139._28_4_ = iVar1;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar114);
          auVar140._0_4_ =
               (uint)(bVar80 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar6._0_4_;
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * auVar6._4_4_;
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * auVar6._8_4_;
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * auVar6._12_4_;
          auVar140._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_;
          auVar140._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_;
          auVar140._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_;
          auVar140._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar218),ZEXT1632(auVar94));
          auVar141._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar9._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * auVar9._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * auVar9._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar141._12_4_ = (float)((uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * auVar9._12_4_);
          fVar179 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_);
          auVar141._16_4_ = fVar179;
          fVar209 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_);
          auVar141._20_4_ = fVar209;
          fVar171 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_);
          auVar141._24_4_ = fVar171;
          auVar141._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar93));
          auVar142._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar10._0_4_);
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * auVar10._4_4_);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * auVar10._8_4_);
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar142._12_4_ = (float)((uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * auVar10._12_4_)
          ;
          fVar178 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_);
          auVar142._16_4_ = fVar178;
          fVar91 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_);
          auVar142._20_4_ = fVar91;
          fVar92 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_);
          auVar142._24_4_ = fVar92;
          iVar2 = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
          auVar142._28_4_ = iVar2;
          auVar143._0_4_ =
               (uint)(bVar80 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar114._0_4_;
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar20 * (int)auVar12._4_4_ | (uint)!bVar20 * auVar114._4_4_;
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar20 * (int)auVar12._8_4_ | (uint)!bVar20 * auVar114._8_4_;
          bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar20 * (int)auVar12._12_4_ | (uint)!bVar20 * auVar114._12_4_;
          auVar143._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar114._16_4_;
          auVar143._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar114._20_4_;
          auVar143._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar114._24_4_;
          auVar143._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar114._28_4_;
          bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar22 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar24 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar23 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar25 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar114 = vsubps_avx512vl(auVar143,auVar107);
          auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar218._12_4_ |
                                                   (uint)!bVar24 * auVar94._12_4_,
                                                   CONCAT48((uint)bVar22 * (int)auVar218._8_4_ |
                                                            (uint)!bVar22 * auVar94._8_4_,
                                                            CONCAT44((uint)bVar20 *
                                                                     (int)auVar218._4_4_ |
                                                                     (uint)!bVar20 * auVar94._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar218._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar94._0_4_)))),auVar108);
          auVar202 = ZEXT3264(auVar118);
          auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar98._12_4_ |
                                                   (uint)!bVar25 * auVar93._12_4_,
                                                   CONCAT48((uint)bVar23 * (int)auVar98._8_4_ |
                                                            (uint)!bVar23 * auVar93._8_4_,
                                                            CONCAT44((uint)bVar21 *
                                                                     (int)auVar98._4_4_ |
                                                                     (uint)!bVar21 * auVar93._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar98._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar93._0_4_)))),auVar139);
          auVar116 = vsubps_avx(auVar107,auVar140);
          auVar204 = ZEXT3264(auVar116);
          auVar112 = vsubps_avx(auVar108,auVar141);
          auVar113 = vsubps_avx(auVar139,auVar142);
          auVar63._4_4_ = auVar117._4_4_ * fVar150;
          auVar63._0_4_ = auVar117._0_4_ * fVar148;
          auVar63._8_4_ = auVar117._8_4_ * fVar152;
          auVar63._12_4_ = auVar117._12_4_ * fVar154;
          auVar63._16_4_ = auVar117._16_4_ * 0.0;
          auVar63._20_4_ = auVar117._20_4_ * 0.0;
          auVar63._24_4_ = auVar117._24_4_ * 0.0;
          auVar63._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar63,auVar139,auVar114);
          auVar186._0_4_ = fVar149 * auVar114._0_4_;
          auVar186._4_4_ = fVar151 * auVar114._4_4_;
          auVar186._8_4_ = fVar153 * auVar114._8_4_;
          auVar186._12_4_ = fVar155 * auVar114._12_4_;
          auVar186._16_4_ = auVar114._16_4_ * 0.0;
          auVar186._20_4_ = auVar114._20_4_ * 0.0;
          auVar186._24_4_ = auVar114._24_4_ * 0.0;
          auVar186._28_4_ = 0;
          auVar93 = vfmsub231ps_fma(auVar186,auVar107,auVar118);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar101,ZEXT1632(auVar94));
          auVar189._0_4_ = auVar118._0_4_ * auVar139._0_4_;
          auVar189._4_4_ = auVar118._4_4_ * auVar139._4_4_;
          auVar189._8_4_ = auVar118._8_4_ * auVar139._8_4_;
          auVar189._12_4_ = auVar118._12_4_ * auVar139._12_4_;
          auVar189._16_4_ = auVar118._16_4_ * fVar206;
          auVar189._20_4_ = auVar118._20_4_ * fVar208;
          auVar189._24_4_ = auVar118._24_4_ * fVar172;
          auVar189._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar189,auVar108,auVar117);
          auVar119 = vfmadd231ps_avx512vl(auVar115,auVar101,ZEXT1632(auVar94));
          auVar115 = vmulps_avx512vl(auVar113,auVar140);
          auVar115 = vfmsub231ps_avx512vl(auVar115,auVar116,auVar142);
          auVar64._4_4_ = auVar112._4_4_ * auVar142._4_4_;
          auVar64._0_4_ = auVar112._0_4_ * auVar142._0_4_;
          auVar64._8_4_ = auVar112._8_4_ * auVar142._8_4_;
          auVar64._12_4_ = auVar112._12_4_ * auVar142._12_4_;
          auVar64._16_4_ = auVar112._16_4_ * fVar178;
          auVar64._20_4_ = auVar112._20_4_ * fVar91;
          auVar64._24_4_ = auVar112._24_4_ * fVar92;
          auVar64._28_4_ = iVar2;
          auVar94 = vfmsub231ps_fma(auVar64,auVar141,auVar113);
          auVar190._0_4_ = auVar141._0_4_ * auVar116._0_4_;
          auVar190._4_4_ = auVar141._4_4_ * auVar116._4_4_;
          auVar190._8_4_ = auVar141._8_4_ * auVar116._8_4_;
          auVar190._12_4_ = auVar141._12_4_ * auVar116._12_4_;
          auVar190._16_4_ = fVar179 * auVar116._16_4_;
          auVar190._20_4_ = fVar209 * auVar116._20_4_;
          auVar190._24_4_ = fVar171 * auVar116._24_4_;
          auVar190._28_4_ = 0;
          auVar93 = vfmsub231ps_fma(auVar190,auVar112,auVar140);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar101,auVar115);
          auVar122 = vfmadd231ps_avx512vl(auVar115,auVar101,ZEXT1632(auVar94));
          auVar193 = ZEXT3264(auVar122);
          auVar115 = vmaxps_avx(auVar119,auVar122);
          uVar169 = vcmpps_avx512vl(auVar115,auVar101,2);
          bVar89 = bVar89 & (byte)uVar169;
          if (bVar89 != 0) {
            auVar65._4_4_ = auVar113._4_4_ * auVar118._4_4_;
            auVar65._0_4_ = auVar113._0_4_ * auVar118._0_4_;
            auVar65._8_4_ = auVar113._8_4_ * auVar118._8_4_;
            auVar65._12_4_ = auVar113._12_4_ * auVar118._12_4_;
            auVar65._16_4_ = auVar113._16_4_ * auVar118._16_4_;
            auVar65._20_4_ = auVar113._20_4_ * auVar118._20_4_;
            auVar65._24_4_ = auVar113._24_4_ * auVar118._24_4_;
            auVar65._28_4_ = auVar115._28_4_;
            auVar8 = vfmsub231ps_fma(auVar65,auVar112,auVar117);
            auVar66._4_4_ = auVar117._4_4_ * auVar116._4_4_;
            auVar66._0_4_ = auVar117._0_4_ * auVar116._0_4_;
            auVar66._8_4_ = auVar117._8_4_ * auVar116._8_4_;
            auVar66._12_4_ = auVar117._12_4_ * auVar116._12_4_;
            auVar66._16_4_ = auVar117._16_4_ * auVar116._16_4_;
            auVar66._20_4_ = auVar117._20_4_ * auVar116._20_4_;
            auVar66._24_4_ = auVar117._24_4_ * auVar116._24_4_;
            auVar66._28_4_ = auVar117._28_4_;
            auVar6 = vfmsub231ps_fma(auVar66,auVar114,auVar113);
            auVar67._4_4_ = auVar112._4_4_ * auVar114._4_4_;
            auVar67._0_4_ = auVar112._0_4_ * auVar114._0_4_;
            auVar67._8_4_ = auVar112._8_4_ * auVar114._8_4_;
            auVar67._12_4_ = auVar112._12_4_ * auVar114._12_4_;
            auVar67._16_4_ = auVar112._16_4_ * auVar114._16_4_;
            auVar67._20_4_ = auVar112._20_4_ * auVar114._20_4_;
            auVar67._24_4_ = auVar112._24_4_ * auVar114._24_4_;
            auVar67._28_4_ = auVar112._28_4_;
            auVar9 = vfmsub231ps_fma(auVar67,auVar116,auVar118);
            auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar9));
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar93));
            auVar117 = auVar221._0_32_;
            auVar118 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar93),auVar117);
            auVar94 = vfmadd132ps_fma(auVar118,auVar115,auVar115);
            auVar202 = ZEXT1664(auVar94);
            auVar68._4_4_ = auVar9._4_4_ * auVar139._4_4_;
            auVar68._0_4_ = auVar9._0_4_ * auVar139._0_4_;
            auVar68._8_4_ = auVar9._8_4_ * auVar139._8_4_;
            auVar68._12_4_ = auVar9._12_4_ * auVar139._12_4_;
            auVar68._16_4_ = fVar206 * 0.0;
            auVar68._20_4_ = fVar208 * 0.0;
            auVar68._24_4_ = fVar172 * 0.0;
            auVar68._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar68,auVar108,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar107,ZEXT1632(auVar8));
            fVar172 = auVar94._0_4_;
            fVar206 = auVar94._4_4_;
            fVar208 = auVar94._8_4_;
            fVar209 = auVar94._12_4_;
            local_400._28_4_ = auVar115._28_4_;
            local_400._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar209,
                                    CONCAT48(auVar6._8_4_ * fVar208,
                                             CONCAT44(auVar6._4_4_ * fVar206,auVar6._0_4_ * fVar172)
                                            )));
            auVar204 = ZEXT3264(local_400);
            auVar78._4_4_ = uStack_57c;
            auVar78._0_4_ = local_580;
            auVar78._8_4_ = uStack_578;
            auVar78._12_4_ = uStack_574;
            auVar78._16_4_ = uStack_570;
            auVar78._20_4_ = uStack_56c;
            auVar78._24_4_ = uStack_568;
            auVar78._28_4_ = uStack_564;
            uVar169 = vcmpps_avx512vl(local_400,auVar78,0xd);
            uVar168 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar34._4_4_ = uVar168;
            auVar34._0_4_ = uVar168;
            auVar34._8_4_ = uVar168;
            auVar34._12_4_ = uVar168;
            auVar34._16_4_ = uVar168;
            auVar34._20_4_ = uVar168;
            auVar34._24_4_ = uVar168;
            auVar34._28_4_ = uVar168;
            uVar29 = vcmpps_avx512vl(local_400,auVar34,2);
            bVar89 = (byte)uVar169 & (byte)uVar29 & bVar89;
            if (bVar89 != 0) {
              uVar90 = vcmpps_avx512vl(ZEXT1632(auVar93),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar90 = bVar89 & uVar90;
              if ((char)uVar90 != '\0') {
                fVar179 = auVar119._0_4_ * fVar172;
                fVar171 = auVar119._4_4_ * fVar206;
                auVar69._4_4_ = fVar171;
                auVar69._0_4_ = fVar179;
                fVar178 = auVar119._8_4_ * fVar208;
                auVar69._8_4_ = fVar178;
                fVar91 = auVar119._12_4_ * fVar209;
                auVar69._12_4_ = fVar91;
                fVar92 = auVar119._16_4_ * 0.0;
                auVar69._16_4_ = fVar92;
                fVar148 = auVar119._20_4_ * 0.0;
                auVar69._20_4_ = fVar148;
                fVar149 = auVar119._24_4_ * 0.0;
                auVar69._24_4_ = fVar149;
                auVar69._28_4_ = auVar119._28_4_;
                auVar115 = vsubps_avx512vl(auVar117,auVar69);
                local_440._0_4_ =
                     (float)((uint)(bVar80 & 1) * (int)fVar179 |
                            (uint)!(bool)(bVar80 & 1) * auVar115._0_4_);
                bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
                local_440._4_4_ =
                     (float)((uint)bVar20 * (int)fVar171 | (uint)!bVar20 * auVar115._4_4_);
                bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
                local_440._8_4_ =
                     (float)((uint)bVar20 * (int)fVar178 | (uint)!bVar20 * auVar115._8_4_);
                bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
                local_440._12_4_ =
                     (float)((uint)bVar20 * (int)fVar91 | (uint)!bVar20 * auVar115._12_4_);
                bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
                local_440._16_4_ =
                     (float)((uint)bVar20 * (int)fVar92 | (uint)!bVar20 * auVar115._16_4_);
                bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
                local_440._20_4_ =
                     (float)((uint)bVar20 * (int)fVar148 | (uint)!bVar20 * auVar115._20_4_);
                bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
                local_440._24_4_ =
                     (float)((uint)bVar20 * (int)fVar149 | (uint)!bVar20 * auVar115._24_4_);
                bVar20 = SUB81(uVar81 >> 7,0);
                local_440._28_4_ =
                     (float)((uint)bVar20 * auVar119._28_4_ | (uint)!bVar20 * auVar115._28_4_);
                auVar115 = vsubps_avx(auVar121,auVar120);
                auVar94 = vfmadd213ps_fma(auVar115,local_440,auVar120);
                uVar168 = *(undefined4 *)((long)local_628->ray_space + k * 4 + -0x20);
                auVar35._4_4_ = uVar168;
                auVar35._0_4_ = uVar168;
                auVar35._8_4_ = uVar168;
                auVar35._12_4_ = uVar168;
                auVar35._16_4_ = uVar168;
                auVar35._20_4_ = uVar168;
                auVar35._24_4_ = uVar168;
                auVar35._28_4_ = uVar168;
                auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                              CONCAT48(auVar94._8_4_ + auVar94._8_4_
                                                                       ,CONCAT44(auVar94._4_4_ +
                                                                                 auVar94._4_4_,
                                                                                 auVar94._0_4_ +
                                                                                 auVar94._0_4_)))),
                                           auVar35);
                uVar28 = vcmpps_avx512vl(local_400,auVar115,6);
                uVar90 = uVar90 & uVar28;
                bVar89 = (byte)uVar90;
                if (bVar89 != 0) {
                  auVar170._0_4_ = auVar122._0_4_ * fVar172;
                  auVar170._4_4_ = auVar122._4_4_ * fVar206;
                  auVar170._8_4_ = auVar122._8_4_ * fVar208;
                  auVar170._12_4_ = auVar122._12_4_ * fVar209;
                  auVar170._16_4_ = auVar122._16_4_ * 0.0;
                  auVar170._20_4_ = auVar122._20_4_ * 0.0;
                  auVar170._24_4_ = auVar122._24_4_ * 0.0;
                  auVar170._28_4_ = 0;
                  auVar115 = vsubps_avx512vl(auVar117,auVar170);
                  auVar144._0_4_ =
                       (uint)(bVar80 & 1) * (int)auVar170._0_4_ |
                       (uint)!(bool)(bVar80 & 1) * auVar115._0_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar144._4_4_ =
                       (uint)bVar20 * (int)auVar170._4_4_ | (uint)!bVar20 * auVar115._4_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar144._8_4_ =
                       (uint)bVar20 * (int)auVar170._8_4_ | (uint)!bVar20 * auVar115._8_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar144._12_4_ =
                       (uint)bVar20 * (int)auVar170._12_4_ | (uint)!bVar20 * auVar115._12_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar144._16_4_ =
                       (uint)bVar20 * (int)auVar170._16_4_ | (uint)!bVar20 * auVar115._16_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar144._20_4_ =
                       (uint)bVar20 * (int)auVar170._20_4_ | (uint)!bVar20 * auVar115._20_4_;
                  bVar20 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar144._24_4_ =
                       (uint)bVar20 * (int)auVar170._24_4_ | (uint)!bVar20 * auVar115._24_4_;
                  auVar144._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar115._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_420 = vfmsub132ps_avx512vl(auVar144,auVar117,auVar36);
                  local_3e0 = (undefined4)lVar84;
                  local_3d0 = local_680;
                  uStack_3c8 = uStack_678;
                  local_3c0 = local_6a0;
                  uStack_3b8 = uStack_698;
                  local_3b0 = local_6b0;
                  uStack_3a8 = uStack_6a8;
                  local_3a0 = local_690;
                  uStack_398 = uStack_688;
                  pGVar86 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar94 = vcvtsi2ss_avx512f(auVar100,local_3e0);
                    fVar172 = auVar94._0_4_;
                    local_380[0] = (fVar172 + local_440._0_4_ + 0.0) * local_100;
                    local_380[1] = (fVar172 + local_440._4_4_ + 1.0) * fStack_fc;
                    local_380[2] = (fVar172 + local_440._8_4_ + 2.0) * fStack_f8;
                    local_380[3] = (fVar172 + local_440._12_4_ + 3.0) * fStack_f4;
                    fStack_370 = (fVar172 + local_440._16_4_ + 4.0) * fStack_f0;
                    fStack_36c = (fVar172 + local_440._20_4_ + 5.0) * fStack_ec;
                    fStack_368 = (fVar172 + local_440._24_4_ + 6.0) * fStack_e8;
                    fStack_364 = fVar172 + local_440._28_4_ + 7.0;
                    local_360 = local_420;
                    local_340 = local_400;
                    auVar163._8_4_ = 0x7f800000;
                    auVar163._0_8_ = 0x7f8000007f800000;
                    auVar163._12_4_ = 0x7f800000;
                    auVar163._16_4_ = 0x7f800000;
                    auVar163._20_4_ = 0x7f800000;
                    auVar163._24_4_ = 0x7f800000;
                    auVar163._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar163,local_400);
                    auVar145._0_4_ =
                         (uint)(bVar89 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 1) & 1);
                    auVar145._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 2) & 1);
                    auVar145._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 3) & 1);
                    auVar145._12_4_ = (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 4) & 1);
                    auVar145._16_4_ = (uint)bVar20 * auVar115._16_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 5) & 1);
                    auVar145._20_4_ = (uint)bVar20 * auVar115._20_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = (bool)((byte)(uVar90 >> 6) & 1);
                    auVar145._24_4_ = (uint)bVar20 * auVar115._24_4_ | (uint)!bVar20 * 0x7f800000;
                    bVar20 = SUB81(uVar90 >> 7,0);
                    auVar145._28_4_ = (uint)bVar20 * auVar115._28_4_ | (uint)!bVar20 * 0x7f800000;
                    auVar115 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar115 = vminps_avx(auVar145,auVar115);
                    auVar118 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar118);
                    auVar118 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar118);
                    uVar169 = vcmpps_avx512vl(auVar145,auVar115,0);
                    uVar83 = (uint)uVar90;
                    if ((bVar89 & (byte)uVar169) != 0) {
                      uVar83 = (uint)(bVar89 & (byte)uVar169);
                    }
                    uVar82 = 0;
                    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                      uVar82 = uVar82 + 1;
                    }
                    uVar81 = (ulong)uVar82;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar223._0_32_);
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_5e0._0_8_ = pGVar86;
                      local_5f8 = uVar85;
                      local_5c0 = local_400;
                      local_3dc = iVar14;
                      do {
                        local_1e0 = local_380[uVar81];
                        local_1c0 = *(undefined4 *)(local_360 + uVar81 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_340 + uVar81 * 4);
                        local_670.context = context->user;
                        fVar206 = 1.0 - local_1e0;
                        fVar172 = fVar206 * fVar206 * -3.0;
                        auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),
                                                  ZEXT416((uint)(local_1e0 * fVar206)),
                                                  ZEXT416(0xc0000000));
                        auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar206)),
                                                  ZEXT416((uint)(local_1e0 * local_1e0)),
                                                  ZEXT416(0x40000000));
                        fVar206 = auVar94._0_4_ * 3.0;
                        fVar208 = auVar93._0_4_ * 3.0;
                        fVar209 = local_1e0 * local_1e0 * 3.0;
                        auVar196._0_4_ = fVar209 * fVar27;
                        auVar196._4_4_ = fVar209 * fVar70;
                        auVar196._8_4_ = fVar209 * fVar71;
                        auVar196._12_4_ = fVar209 * fVar79;
                        auVar157._4_4_ = fVar208;
                        auVar157._0_4_ = fVar208;
                        auVar157._8_4_ = fVar208;
                        auVar157._12_4_ = fVar208;
                        auVar94 = vfmadd132ps_fma(auVar157,auVar196,auVar96);
                        auVar184._4_4_ = fVar206;
                        auVar184._0_4_ = fVar206;
                        auVar184._8_4_ = fVar206;
                        auVar184._12_4_ = fVar206;
                        auVar94 = vfmadd132ps_fma(auVar184,auVar94,auVar156);
                        auVar158._4_4_ = fVar172;
                        auVar158._0_4_ = fVar172;
                        auVar158._8_4_ = fVar172;
                        auVar158._12_4_ = fVar172;
                        auVar94 = vfmadd132ps_fma(auVar158,auVar94,auVar7);
                        local_240 = auVar94._0_4_;
                        auVar191._8_4_ = 1;
                        auVar191._0_8_ = 0x100000001;
                        auVar191._12_4_ = 1;
                        auVar191._16_4_ = 1;
                        auVar191._20_4_ = 1;
                        auVar191._24_4_ = 1;
                        auVar191._28_4_ = 1;
                        local_220 = vpermps_avx2(auVar191,ZEXT1632(auVar94));
                        auVar193 = ZEXT3264(local_220);
                        auVar197._8_4_ = 2;
                        auVar197._0_8_ = 0x200000002;
                        auVar197._12_4_ = 2;
                        auVar200._16_4_ = 2;
                        auVar200._0_16_ = auVar197;
                        auVar200._20_4_ = 2;
                        auVar200._24_4_ = 2;
                        auVar200._28_4_ = 2;
                        auVar202 = ZEXT3264(auVar200);
                        local_200 = vpermps_avx2(auVar200,ZEXT1632(auVar94));
                        iStack_23c = local_240;
                        iStack_238 = local_240;
                        iStack_234 = local_240;
                        iStack_230 = local_240;
                        iStack_22c = local_240;
                        iStack_228 = local_240;
                        iStack_224 = local_240;
                        fStack_1dc = local_1e0;
                        fStack_1d8 = local_1e0;
                        fStack_1d4 = local_1e0;
                        fStack_1d0 = local_1e0;
                        fStack_1cc = local_1e0;
                        fStack_1c8 = local_1e0;
                        fStack_1c4 = local_1e0;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_300._0_8_;
                        uStack_198 = local_300._8_8_;
                        uStack_190 = local_300._16_8_;
                        uStack_188 = local_300._24_8_;
                        local_180 = local_2e0;
                        auVar115 = vpcmpeqd_avx2(local_2e0,local_2e0);
                        local_630[1] = auVar115;
                        *local_630 = auVar115;
                        local_160 = (local_670.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_670.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_620 = local_320;
                        local_670.valid = (int *)local_620;
                        local_670.geometryUserPtr = pGVar86->userPtr;
                        local_670.hit = (RTCHitN *)&local_240;
                        local_670.N = 8;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar193 = ZEXT1664(local_220._0_16_);
                          auVar202 = ZEXT1664(auVar197);
                          (*pGVar86->intersectionFilterN)(&local_670);
                          auVar204 = ZEXT3264(local_5c0);
                          pGVar86 = (Geometry *)local_5e0._0_8_;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_01b79123:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            auVar202 = ZEXT1664(auVar202._0_16_);
                            (*p_Var19)(&local_670);
                            auVar204 = ZEXT3264(local_5c0);
                            pGVar86 = (Geometry *)local_5e0._0_8_;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_01b79123;
                          uVar85 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar72 = *(int *)(local_670.hit + 0xc);
                          iVar73 = *(int *)(local_670.hit + 0x10);
                          iVar74 = *(int *)(local_670.hit + 0x14);
                          iVar75 = *(int *)(local_670.hit + 0x18);
                          iVar76 = *(int *)(local_670.hit + 0x1c);
                          bVar89 = (byte)uVar85;
                          bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar26 = SUB81(uVar85 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar89 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar72 = *(int *)(local_670.hit + 0x2c);
                          iVar73 = *(int *)(local_670.hit + 0x30);
                          iVar74 = *(int *)(local_670.hit + 0x34);
                          iVar75 = *(int *)(local_670.hit + 0x38);
                          iVar76 = *(int *)(local_670.hit + 0x3c);
                          bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar26 = SUB81(uVar85 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar72 = *(int *)(local_670.hit + 0x4c);
                          iVar73 = *(int *)(local_670.hit + 0x50);
                          iVar74 = *(int *)(local_670.hit + 0x54);
                          iVar75 = *(int *)(local_670.hit + 0x58);
                          iVar76 = *(int *)(local_670.hit + 0x5c);
                          bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar26 = SUB81(uVar85 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar72 = *(int *)(local_670.hit + 0x6c);
                          iVar73 = *(int *)(local_670.hit + 0x70);
                          iVar74 = *(int *)(local_670.hit + 0x74);
                          iVar75 = *(int *)(local_670.hit + 0x78);
                          iVar76 = *(int *)(local_670.hit + 0x7c);
                          bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar26 = SUB81(uVar85 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar72 = *(int *)(local_670.hit + 0x8c);
                          iVar73 = *(int *)(local_670.hit + 0x90);
                          iVar74 = *(int *)(local_670.hit + 0x94);
                          iVar75 = *(int *)(local_670.hit + 0x98);
                          iVar76 = *(int *)(local_670.hit + 0x9c);
                          bVar20 = (bool)((byte)(uVar85 >> 1) & 1);
                          bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
                          bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
                          bVar23 = (bool)((byte)(uVar85 >> 4) & 1);
                          bVar24 = (bool)((byte)(uVar85 >> 5) & 1);
                          bVar25 = (bool)((byte)(uVar85 >> 6) & 1);
                          bVar26 = SUB81(uVar85 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar89 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar89 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar20 * iVar1 |
                               (uint)!bVar20 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar21 * iVar2 |
                               (uint)!bVar21 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar24 * iVar74 |
                               (uint)!bVar24 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar25 * iVar75 |
                               (uint)!bVar25 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar26 * iVar76 |
                               (uint)!bVar26 * *(int *)(local_670.ray + 0x21c);
                          auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar115;
                          auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar115;
                          auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar115;
                          auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar115;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        bVar89 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar90;
                        auVar164._4_4_ = local_640._0_4_;
                        auVar164._0_4_ = local_640._0_4_;
                        auVar164._8_4_ = local_640._0_4_;
                        auVar164._12_4_ = local_640._0_4_;
                        auVar164._16_4_ = local_640._0_4_;
                        auVar164._20_4_ = local_640._0_4_;
                        auVar164._24_4_ = local_640._0_4_;
                        auVar164._28_4_ = local_640._0_4_;
                        uVar169 = vcmpps_avx512vl(auVar204._0_32_,auVar164,2);
                        if ((bVar89 & (byte)uVar169) == 0) goto LAB_01b791c9;
                        bVar89 = bVar89 & (byte)uVar169;
                        auVar165._8_4_ = 0x7f800000;
                        auVar165._0_8_ = 0x7f8000007f800000;
                        auVar165._12_4_ = 0x7f800000;
                        auVar165._16_4_ = 0x7f800000;
                        auVar165._20_4_ = 0x7f800000;
                        auVar165._24_4_ = 0x7f800000;
                        auVar165._28_4_ = 0x7f800000;
                        auVar115 = vblendmps_avx512vl(auVar165,auVar204._0_32_);
                        auVar146._0_4_ =
                             (uint)(bVar89 & 1) * auVar115._0_4_ |
                             (uint)!(bool)(bVar89 & 1) * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar20 * auVar115._4_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar20 * auVar115._8_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar20 * auVar115._12_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar20 * auVar115._16_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar20 * auVar115._20_4_ | (uint)!bVar20 * 0x7f800000;
                        bVar20 = (bool)(bVar89 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar20 * auVar115._24_4_ | (uint)!bVar20 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar89 >> 7) * auVar115._28_4_ |
                             (uint)!(bool)(bVar89 >> 7) * 0x7f800000;
                        auVar115 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar115 = vminps_avx(auVar146,auVar115);
                        auVar118 = vshufpd_avx(auVar115,auVar115,5);
                        auVar115 = vminps_avx(auVar115,auVar118);
                        auVar118 = vpermpd_avx2(auVar115,0x4e);
                        auVar115 = vminps_avx(auVar115,auVar118);
                        uVar169 = vcmpps_avx512vl(auVar146,auVar115,0);
                        bVar80 = (byte)uVar169 & bVar89;
                        uVar90 = (ulong)bVar89;
                        if (bVar80 != 0) {
                          bVar89 = bVar80;
                        }
                        uVar83 = 0;
                        for (uVar82 = (uint)bVar89; (uVar82 & 1) == 0;
                            uVar82 = uVar82 >> 1 | 0x80000000) {
                          uVar83 = uVar83 + 1;
                        }
                        uVar81 = (ulong)uVar83;
                      } while( true );
                    }
                    fVar172 = local_380[uVar81];
                    uVar168 = *(undefined4 *)(local_360 + uVar81 * 4);
                    fVar208 = 1.0 - fVar172;
                    fVar206 = fVar208 * fVar208 * -3.0;
                    auVar193 = ZEXT464((uint)fVar206);
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                              ZEXT416((uint)(fVar172 * fVar208)),ZEXT416(0xc0000000)
                                             );
                    auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar172 * fVar208)),
                                              ZEXT416((uint)(fVar172 * fVar172)),ZEXT416(0x40000000)
                                             );
                    fVar208 = auVar94._0_4_ * 3.0;
                    fVar209 = auVar93._0_4_ * 3.0;
                    fVar179 = fVar172 * fVar172 * 3.0;
                    auVar195._0_4_ = fVar179 * fVar27;
                    auVar195._4_4_ = fVar179 * fVar70;
                    auVar195._8_4_ = fVar179 * fVar71;
                    auVar195._12_4_ = fVar179 * fVar79;
                    auVar202 = ZEXT1664(auVar195);
                    auVar175._4_4_ = fVar209;
                    auVar175._0_4_ = fVar209;
                    auVar175._8_4_ = fVar209;
                    auVar175._12_4_ = fVar209;
                    auVar94 = vfmadd132ps_fma(auVar175,auVar195,auVar96);
                    auVar183._4_4_ = fVar208;
                    auVar183._0_4_ = fVar208;
                    auVar183._8_4_ = fVar208;
                    auVar183._12_4_ = fVar208;
                    auVar94 = vfmadd132ps_fma(auVar183,auVar94,auVar156);
                    auVar176._4_4_ = fVar206;
                    auVar176._0_4_ = fVar206;
                    auVar176._8_4_ = fVar206;
                    auVar176._12_4_ = fVar206;
                    auVar94 = vfmadd132ps_fma(auVar176,auVar94,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar81 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar94._0_4_;
                    uVar15 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar15;
                    uVar15 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar15;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar172;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar168;
                    *(int *)(ray + k * 4 + 0x220) = (int)uVar85;
                    *(uint *)(ray + k * 4 + 0x240) = uVar13;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01b78e03;
      }
    }
    uVar168 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar33._4_4_ = uVar168;
    auVar33._0_4_ = uVar168;
    auVar33._8_4_ = uVar168;
    auVar33._12_4_ = uVar168;
    auVar33._16_4_ = uVar168;
    auVar33._20_4_ = uVar168;
    auVar33._24_4_ = uVar168;
    auVar33._28_4_ = uVar168;
    uVar169 = vcmpps_avx512vl(auVar222._0_32_,auVar33,2);
    local_5e8 = (ulong)((uint)local_5e8 & (uint)local_5e8 + 0xff & (uint)uVar169);
  } while( true );
LAB_01b791c9:
  auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar221 = ZEXT3264(auVar115);
  auVar222 = ZEXT3264(local_560);
  auVar115 = vmovdqa64_avx512vl(local_120);
  auVar223 = ZEXT3264(auVar115);
  uVar85 = local_5f8;
LAB_01b78e03:
  lVar84 = lVar84 + 8;
  goto LAB_01b78574;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }